

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  uint uVar58;
  int iVar59;
  ulong uVar60;
  byte bVar61;
  uint uVar62;
  uint uVar63;
  long lVar64;
  ulong uVar65;
  uint uVar66;
  long lVar67;
  uint uVar68;
  bool bVar69;
  float fVar70;
  float fVar99;
  float fVar100;
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar71;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar101;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined8 uVar102;
  vint4 bi_1;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar142;
  float fVar143;
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar144;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar180;
  float fVar181;
  vint4 ai_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar182;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  vint4 ai_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  vint4 ai;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar233;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar234;
  undefined1 auVar231 [32];
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar244 [16];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar253;
  float fVar265;
  undefined1 auVar254 [16];
  float fVar266;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar293 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar279;
  float fVar289;
  float fVar290;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar291;
  float fVar302;
  float fVar303;
  undefined1 auVar292 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar304;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar321 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float local_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_660 [8];
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  uint local_588;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined4 local_4e0;
  undefined4 local_4d0;
  uint auStack_4c0 [4];
  RTCFilterFunctionNArguments local_4b0;
  undefined1 local_480 [32];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  uint uStack_320;
  float afStack_31c [7];
  undefined1 local_300 [32];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint uStack_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar332 [32];
  
  PVar6 = prim[1];
  uVar60 = (ulong)(byte)PVar6;
  lVar64 = uVar60 * 0x25;
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar70 = *(float *)(prim + lVar64 + 0x12);
  auVar14 = vsubps_avx(auVar14,*(undefined1 (*) [16])(prim + lVar64 + 6));
  auVar72._0_4_ = fVar70 * auVar14._0_4_;
  auVar72._4_4_ = fVar70 * auVar14._4_4_;
  auVar72._8_4_ = fVar70 * auVar14._8_4_;
  auVar72._12_4_ = fVar70 * auVar14._12_4_;
  auVar111._0_4_ = fVar70 * auVar15._0_4_;
  auVar111._4_4_ = fVar70 * auVar15._4_4_;
  auVar111._8_4_ = fVar70 * auVar15._8_4_;
  auVar111._12_4_ = fVar70 * auVar15._12_4_;
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar60 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1a + 6)));
  auVar169 = vcvtdq2ps_avx(auVar169);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0x1c + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar316._4_4_ = auVar111._0_4_;
  auVar316._0_4_ = auVar111._0_4_;
  auVar316._8_4_ = auVar111._0_4_;
  auVar316._12_4_ = auVar111._0_4_;
  auVar21 = vshufps_avx(auVar111,auVar111,0x55);
  auVar22 = vshufps_avx(auVar111,auVar111,0xaa);
  fVar70 = auVar22._0_4_;
  auVar267._0_4_ = fVar70 * auVar87._0_4_;
  fVar99 = auVar22._4_4_;
  auVar267._4_4_ = fVar99 * auVar87._4_4_;
  fVar100 = auVar22._8_4_;
  auVar267._8_4_ = fVar100 * auVar87._8_4_;
  fVar146 = auVar22._12_4_;
  auVar267._12_4_ = fVar146 * auVar87._12_4_;
  auVar189._0_4_ = auVar169._0_4_ * fVar70;
  auVar189._4_4_ = auVar169._4_4_ * fVar99;
  auVar189._8_4_ = auVar169._8_4_ * fVar100;
  auVar189._12_4_ = auVar169._12_4_ * fVar146;
  auVar155._0_4_ = auVar20._0_4_ * fVar70;
  auVar155._4_4_ = auVar20._4_4_ * fVar99;
  auVar155._8_4_ = auVar20._8_4_ * fVar100;
  auVar155._12_4_ = auVar20._12_4_ * fVar146;
  auVar22 = vfmadd231ps_fma(auVar267,auVar21,auVar15);
  auVar30 = vfmadd231ps_fma(auVar189,auVar21,auVar18);
  auVar21 = vfmadd231ps_fma(auVar155,auVar167,auVar21);
  auVar74 = vfmadd231ps_fma(auVar22,auVar316,auVar14);
  auVar30 = vfmadd231ps_fma(auVar30,auVar316,auVar17);
  auVar75 = vfmadd231ps_fma(auVar21,auVar19,auVar316);
  auVar317._4_4_ = auVar72._0_4_;
  auVar317._0_4_ = auVar72._0_4_;
  auVar317._8_4_ = auVar72._0_4_;
  auVar317._12_4_ = auVar72._0_4_;
  auVar21 = vshufps_avx(auVar72,auVar72,0x55);
  auVar22 = vshufps_avx(auVar72,auVar72,0xaa);
  fVar70 = auVar22._0_4_;
  auVar293._0_4_ = fVar70 * auVar87._0_4_;
  fVar99 = auVar22._4_4_;
  auVar293._4_4_ = fVar99 * auVar87._4_4_;
  fVar100 = auVar22._8_4_;
  auVar293._8_4_ = fVar100 * auVar87._8_4_;
  fVar146 = auVar22._12_4_;
  auVar293._12_4_ = fVar146 * auVar87._12_4_;
  auVar103._0_4_ = auVar169._0_4_ * fVar70;
  auVar103._4_4_ = auVar169._4_4_ * fVar99;
  auVar103._8_4_ = auVar169._8_4_ * fVar100;
  auVar103._12_4_ = auVar169._12_4_ * fVar146;
  auVar73._0_4_ = auVar20._0_4_ * fVar70;
  auVar73._4_4_ = auVar20._4_4_ * fVar99;
  auVar73._8_4_ = auVar20._8_4_ * fVar100;
  auVar73._12_4_ = auVar20._12_4_ * fVar146;
  auVar15 = vfmadd231ps_fma(auVar293,auVar21,auVar15);
  auVar87 = vfmadd231ps_fma(auVar103,auVar21,auVar18);
  auVar18 = vfmadd231ps_fma(auVar73,auVar21,auVar167);
  auVar103 = vfmadd231ps_fma(auVar15,auVar317,auVar14);
  auVar104 = vfmadd231ps_fma(auVar87,auVar317,auVar17);
  auVar327._8_4_ = 0x7fffffff;
  auVar327._0_8_ = 0x7fffffff7fffffff;
  auVar327._12_4_ = 0x7fffffff;
  auVar14 = vandps_avx(auVar74,auVar327);
  auVar218._8_4_ = 0x219392ef;
  auVar218._0_8_ = 0x219392ef219392ef;
  auVar218._12_4_ = 0x219392ef;
  auVar14 = vcmpps_avx(auVar14,auVar218,1);
  auVar15 = vblendvps_avx(auVar74,auVar218,auVar14);
  auVar14 = vandps_avx(auVar30,auVar327);
  auVar14 = vcmpps_avx(auVar14,auVar218,1);
  auVar87 = vblendvps_avx(auVar30,auVar218,auVar14);
  auVar14 = vandps_avx(auVar75,auVar327);
  auVar14 = vcmpps_avx(auVar14,auVar218,1);
  auVar14 = vblendvps_avx(auVar75,auVar218,auVar14);
  auVar105 = vfmadd231ps_fma(auVar18,auVar317,auVar19);
  auVar17 = vrcpps_avx(auVar15);
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = 0x3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar17,auVar219);
  auVar74 = vfmadd132ps_fma(auVar15,auVar17,auVar17);
  auVar15 = vrcpps_avx(auVar87);
  auVar87 = vfnmadd213ps_fma(auVar87,auVar15,auVar219);
  auVar75 = vfmadd132ps_fma(auVar87,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar14);
  auVar14 = vfnmadd213ps_fma(auVar14,auVar15,auVar219);
  auVar72 = vfmadd132ps_fma(auVar14,auVar15,auVar15);
  fVar70 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar64 + 0x16)) *
           *(float *)(prim + lVar64 + 0x1a);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar14 = vpmovsxwd_avx(auVar14);
  auVar201._4_4_ = fVar70;
  auVar201._0_4_ = fVar70;
  auVar201._8_4_ = fVar70;
  auVar201._12_4_ = fVar70;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar73 = vfmadd213ps_fma(auVar15,auVar201,auVar14);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar14 = vpmovsxwd_avx(auVar87);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar15 = vpmovsxwd_avx(auVar17);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar87 = vfmadd213ps_fma(auVar15,auVar201,auVar14);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar14 = vpmovsxwd_avx(auVar18);
  uVar65 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar60 * 2 + uVar65 + 6);
  auVar15 = vpmovsxwd_avx(auVar169);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar17 = vfmadd213ps_fma(auVar15,auVar201,auVar14);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar14 = vpmovsxwd_avx(auVar19);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar60 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar167);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar18 = vfmadd213ps_fma(auVar15,auVar201,auVar14);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar60 * 0x1d + 6);
  auVar14 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar60 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar21);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar169 = vfmadd213ps_fma(auVar15,auVar201,auVar14);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar60) + 6);
  auVar14 = vpmovsxwd_avx(auVar22);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar60 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar30);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar14);
  auVar15 = vfmadd213ps_fma(auVar15,auVar201,auVar14);
  auVar14 = vsubps_avx(auVar73,auVar103);
  auVar285._0_4_ = auVar74._0_4_ * auVar14._0_4_;
  auVar285._4_4_ = auVar74._4_4_ * auVar14._4_4_;
  auVar285._8_4_ = auVar74._8_4_ * auVar14._8_4_;
  auVar285._12_4_ = auVar74._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar87,auVar103);
  auVar130._0_4_ = auVar74._0_4_ * auVar14._0_4_;
  auVar130._4_4_ = auVar74._4_4_ * auVar14._4_4_;
  auVar130._8_4_ = auVar74._8_4_ * auVar14._8_4_;
  auVar130._12_4_ = auVar74._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar17,auVar104);
  auVar183._0_4_ = auVar75._0_4_ * auVar14._0_4_;
  auVar183._4_4_ = auVar75._4_4_ * auVar14._4_4_;
  auVar183._8_4_ = auVar75._8_4_ * auVar14._8_4_;
  auVar183._12_4_ = auVar75._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar18,auVar104);
  auVar104._0_4_ = auVar75._0_4_ * auVar14._0_4_;
  auVar104._4_4_ = auVar75._4_4_ * auVar14._4_4_;
  auVar104._8_4_ = auVar75._8_4_ * auVar14._8_4_;
  auVar104._12_4_ = auVar75._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar169,auVar105);
  auVar165._0_4_ = auVar72._0_4_ * auVar14._0_4_;
  auVar165._4_4_ = auVar72._4_4_ * auVar14._4_4_;
  auVar165._8_4_ = auVar72._8_4_ * auVar14._8_4_;
  auVar165._12_4_ = auVar72._12_4_ * auVar14._12_4_;
  auVar14 = vsubps_avx(auVar15,auVar105);
  auVar74._0_4_ = auVar72._0_4_ * auVar14._0_4_;
  auVar74._4_4_ = auVar72._4_4_ * auVar14._4_4_;
  auVar74._8_4_ = auVar72._8_4_ * auVar14._8_4_;
  auVar74._12_4_ = auVar72._12_4_ * auVar14._12_4_;
  auVar14 = vpminsd_avx(auVar285,auVar130);
  auVar15 = vpminsd_avx(auVar183,auVar104);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vpminsd_avx(auVar165,auVar74);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar238._4_4_ = uVar71;
  auVar238._0_4_ = uVar71;
  auVar238._8_4_ = uVar71;
  auVar238._12_4_ = uVar71;
  auVar15 = vmaxps_avx(auVar15,auVar238);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  local_410._0_4_ = auVar14._0_4_ * 0.99999964;
  local_410._4_4_ = auVar14._4_4_ * 0.99999964;
  local_410._8_4_ = auVar14._8_4_ * 0.99999964;
  local_410._12_4_ = auVar14._12_4_ * 0.99999964;
  auVar14 = vpmaxsd_avx(auVar285,auVar130);
  auVar15 = vpmaxsd_avx(auVar183,auVar104);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar15 = vpmaxsd_avx(auVar165,auVar74);
  uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar131._4_4_ = uVar71;
  auVar131._0_4_ = uVar71;
  auVar131._8_4_ = uVar71;
  auVar131._12_4_ = uVar71;
  auVar15 = vminps_avx(auVar15,auVar131);
  auVar14 = vminps_avx(auVar14,auVar15);
  auVar75._0_4_ = auVar14._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar14._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar14._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar14._12_4_ * 1.0000004;
  auVar105._1_3_ = 0;
  auVar105[0] = PVar6;
  auVar105[4] = PVar6;
  auVar105._5_3_ = 0;
  auVar105[8] = PVar6;
  auVar105._9_3_ = 0;
  auVar105[0xc] = PVar6;
  auVar105._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar105,_DAT_01f7fcf0);
  auVar14 = vcmpps_avx(local_410,auVar75,2);
  auVar14 = vandps_avx(auVar14,auVar15);
  uVar58 = vmovmskps_avx(auVar14);
  if (uVar58 == 0) {
    return false;
  }
  uVar58 = uVar58 & 0xff;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  iVar59 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar59;
  auVar96._0_4_ = iVar59;
  auVar96._8_4_ = iVar59;
  auVar96._12_4_ = iVar59;
  auVar96._16_4_ = iVar59;
  auVar96._20_4_ = iVar59;
  auVar96._24_4_ = iVar59;
  auVar96._28_4_ = iVar59;
  auVar24 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar95 = vpand_avx2(auVar96,auVar24);
  local_300 = vpcmpeqd_avx2(auVar95,auVar24);
  auVar334 = ZEXT864(0);
LAB_016e0dac:
  lVar64 = 0;
  for (uVar60 = (ulong)uVar58; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar63 = *(uint *)(prim + 2);
  local_2e0 = *(uint *)(prim + lVar64 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar63].ptr;
  fVar70 = (pGVar7->time_range).lower;
  fVar100 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar70) / ((pGVar7->time_range).upper - fVar70));
  auVar14 = vroundss_avx(ZEXT416((uint)fVar100),ZEXT416((uint)fVar100),9);
  auVar14 = vminss_avx(auVar14,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar21 = vmaxss_avx(auVar334._0_16_,auVar14);
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)local_2e0 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar67 = (long)(int)auVar21._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar67);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar67);
  auVar14 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar60);
  lVar64 = uVar60 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar64);
  lVar1 = uVar60 + 2;
  auVar87 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar60 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar9 + lVar10 * lVar2);
  auVar56 = *pauVar3;
  fVar70 = *(float *)pauVar3[1];
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar67);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar67);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar60);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar64);
  auVar169 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar99 = *pfVar4;
  fVar146 = pfVar4[1];
  fVar147 = pfVar4[2];
  fVar145 = pfVar4[3];
  auVar111 = ZEXT816(0) << 0x40;
  auVar280._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar280._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar280._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar280._12_4_ = fVar70 * 0.0;
  auVar148._8_4_ = 0x3e2aaaab;
  auVar148._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar148._12_4_ = 0x3e2aaaab;
  auVar74 = vfmadd213ps_fma(auVar148,auVar87,auVar280);
  auVar318._8_4_ = 0x3f000000;
  auVar318._0_8_ = 0x3f0000003f000000;
  auVar318._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar280,auVar87,auVar318);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar15,auVar111);
  auVar130 = vfnmadd231ps_fma(auVar19,auVar14,auVar318);
  auVar184._0_4_ = fVar99 * 0.0;
  auVar184._4_4_ = fVar146 * 0.0;
  auVar184._8_4_ = fVar147 * 0.0;
  auVar184._12_4_ = fVar145 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar148,auVar169,auVar184);
  auVar149._8_4_ = 0x3f2aaaab;
  auVar149._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar149._12_4_ = 0x3f2aaaab;
  auVar19 = vfmadd231ps_fma(auVar19,auVar18,auVar149);
  auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar148);
  auVar167 = vfmadd231ps_fma(auVar184,auVar169,auVar318);
  auVar167 = vfnmadd231ps_fma(auVar167,auVar18,auVar111);
  auVar20 = vfnmadd231ps_fma(auVar167,auVar17,auVar318);
  auVar292._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar292._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar292._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar292._12_4_ = fVar70 * 0.5;
  auVar167 = vfmadd231ps_fma(auVar292,auVar111,auVar87);
  auVar167 = vfnmadd231ps_fma(auVar167,auVar318,auVar15);
  auVar131 = vfnmadd231ps_fma(auVar167,auVar111,auVar14);
  auVar239._0_4_ = fVar99 * 0.16666667;
  auVar239._4_4_ = fVar146 * 0.16666667;
  auVar239._8_4_ = fVar147 * 0.16666667;
  auVar239._12_4_ = fVar145 * 0.16666667;
  auVar167 = vfmadd231ps_fma(auVar239,auVar169,auVar149);
  auVar167 = vfmadd231ps_fma(auVar167,auVar18,auVar148);
  auVar167 = vfmadd231ps_fma(auVar167,auVar17,auVar111);
  auVar202._0_4_ = fVar99 * 0.5;
  auVar202._4_4_ = fVar146 * 0.5;
  auVar202._8_4_ = fVar147 * 0.5;
  auVar202._12_4_ = fVar145 * 0.5;
  auVar169 = vfmadd231ps_fma(auVar202,auVar111,auVar169);
  auVar18 = vfnmadd231ps_fma(auVar169,auVar318,auVar18);
  auVar169 = vfnmadd231ps_fma(auVar18,auVar111,auVar17);
  auVar17 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar279 = auVar130._0_4_;
  auVar106._0_4_ = fVar279 * auVar18._0_4_;
  fVar289 = auVar130._4_4_;
  auVar106._4_4_ = fVar289 * auVar18._4_4_;
  fVar290 = auVar130._8_4_;
  auVar106._8_4_ = fVar290 * auVar18._8_4_;
  fVar101 = auVar130._12_4_;
  auVar106._12_4_ = fVar101 * auVar18._12_4_;
  auVar72 = vfmsub231ps_fma(auVar106,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar107._0_4_ = fVar279 * auVar18._0_4_;
  auVar107._4_4_ = fVar289 * auVar18._4_4_;
  auVar107._8_4_ = fVar290 * auVar18._8_4_;
  auVar107._12_4_ = fVar101 * auVar18._12_4_;
  auVar73 = vfmsub231ps_fma(auVar107,auVar17,auVar20);
  auVar17 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar18 = vshufps_avx(auVar167,auVar167,0xc9);
  fVar291 = auVar131._0_4_;
  auVar108._0_4_ = fVar291 * auVar18._0_4_;
  fVar302 = auVar131._4_4_;
  auVar108._4_4_ = fVar302 * auVar18._4_4_;
  fVar303 = auVar131._8_4_;
  auVar108._8_4_ = fVar303 * auVar18._8_4_;
  fVar304 = auVar131._12_4_;
  auVar108._12_4_ = fVar304 * auVar18._12_4_;
  auVar103 = vfmsub231ps_fma(auVar108,auVar17,auVar167);
  auVar18 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar109._0_4_ = fVar291 * auVar18._0_4_;
  auVar109._4_4_ = fVar302 * auVar18._4_4_;
  auVar109._8_4_ = fVar303 * auVar18._8_4_;
  auVar109._12_4_ = fVar304 * auVar18._12_4_;
  auVar104 = vfmsub231ps_fma(auVar109,auVar17,auVar169);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar67);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar67);
  auVar17 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar57 = *pauVar3;
  fVar145 = *(float *)pauVar3[1];
  lVar12 = *(long *)(lVar9 + 0x38 + lVar67);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar67);
  auVar254._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar254._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar254._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar254._12_4_ = fVar145 * 0.0;
  auVar75 = vfmadd213ps_fma(auVar148,auVar17,auVar254);
  auVar169 = vfmadd231ps_fma(auVar254,auVar17,auVar318);
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar64);
  auVar19 = vfnmadd231ps_fma(auVar169,auVar18,auVar111);
  auVar169 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar60);
  auVar165 = vfnmadd231ps_fma(auVar19,auVar169,auVar318);
  auVar19 = *(undefined1 (*) [16])(lVar12 + lVar1 * lVar9);
  pfVar4 = (float *)(lVar12 + lVar9 * lVar2);
  fVar99 = *pfVar4;
  fVar146 = pfVar4[1];
  fVar147 = pfVar4[2];
  fVar129 = pfVar4[3];
  auVar76._0_4_ = fVar99 * 0.0;
  auVar76._4_4_ = fVar146 * 0.0;
  auVar76._8_4_ = fVar147 * 0.0;
  auVar76._12_4_ = fVar129 * 0.0;
  auVar20 = vfmadd213ps_fma(auVar148,auVar19,auVar76);
  auVar167 = *(undefined1 (*) [16])(lVar12 + lVar64 * lVar9);
  auVar110._8_4_ = 0x3f2aaaab;
  auVar110._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar110._12_4_ = 0x3f2aaaab;
  auVar22 = vfmadd231ps_fma(auVar20,auVar167,auVar110);
  auVar20 = *(undefined1 (*) [16])(lVar12 + uVar60 * lVar9);
  auVar30 = vfmadd231ps_fma(auVar22,auVar20,auVar148);
  auVar22 = vshufps_avx(auVar30,auVar30,0xc9);
  fVar237 = auVar165._0_4_;
  auVar185._0_4_ = fVar237 * auVar22._0_4_;
  fVar253 = auVar165._4_4_;
  auVar185._4_4_ = fVar253 * auVar22._4_4_;
  fVar265 = auVar165._8_4_;
  auVar185._8_4_ = fVar265 * auVar22._8_4_;
  fVar266 = auVar165._12_4_;
  auVar185._12_4_ = fVar266 * auVar22._12_4_;
  auVar22 = vshufps_avx(auVar165,auVar165,0xc9);
  auVar105 = vfmsub231ps_fma(auVar185,auVar22,auVar30);
  auVar30 = vfmadd231ps_fma(auVar76,auVar19,auVar318);
  auVar30 = vfnmadd231ps_fma(auVar30,auVar167,auVar111);
  auVar111 = vfnmadd231ps_fma(auVar30,auVar20,auVar318);
  auVar30 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar220._0_4_ = fVar237 * auVar30._0_4_;
  auVar220._4_4_ = fVar253 * auVar30._4_4_;
  auVar220._8_4_ = fVar265 * auVar30._8_4_;
  auVar220._12_4_ = fVar266 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar220,auVar22,auVar111);
  auVar77._0_4_ = fVar99 * 0.16666667;
  auVar77._4_4_ = fVar146 * 0.16666667;
  auVar77._8_4_ = fVar147 * 0.16666667;
  auVar77._12_4_ = fVar129 * 0.16666667;
  auVar166._8_4_ = 0x3f2aaaab;
  auVar166._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar166._12_4_ = 0x3f2aaaab;
  auVar22 = vfmadd231ps_fma(auVar77,auVar19,auVar166);
  auVar150._0_4_ = fVar99 * 0.5;
  auVar150._4_4_ = fVar146 * 0.5;
  auVar150._8_4_ = fVar147 * 0.5;
  auVar150._12_4_ = fVar129 * 0.5;
  auVar111 = ZEXT816(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar150,auVar111,auVar19);
  auVar22 = vfmadd231ps_fma(auVar22,auVar167,auVar148);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar318,auVar167);
  auVar167 = vfmadd231ps_fma(auVar22,auVar20,auVar111);
  auVar20 = vfnmadd231ps_fma(auVar19,auVar111,auVar20);
  local_770 = auVar57._0_4_;
  fStack_76c = auVar57._4_4_;
  fStack_768 = auVar57._8_4_;
  auVar203._0_4_ = local_770 * 0.5;
  auVar203._4_4_ = fStack_76c * 0.5;
  auVar203._8_4_ = fStack_768 * 0.5;
  auVar203._12_4_ = fVar145 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar203,auVar111,auVar17);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar318,auVar18);
  auVar183 = vfnmadd231ps_fma(auVar19,auVar111,auVar169);
  auVar19 = vshufps_avx(auVar167,auVar167,0xc9);
  fVar233 = auVar183._0_4_;
  auVar112._0_4_ = fVar233 * auVar19._0_4_;
  fVar234 = auVar183._4_4_;
  auVar112._4_4_ = fVar234 * auVar19._4_4_;
  fVar235 = auVar183._8_4_;
  auVar112._8_4_ = fVar235 * auVar19._8_4_;
  fVar236 = auVar183._12_4_;
  auVar112._12_4_ = fVar236 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar183,auVar183,0xc9);
  auVar111 = vfmsub231ps_fma(auVar112,auVar19,auVar167);
  auVar167 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar78._0_4_ = fVar233 * auVar167._0_4_;
  auVar78._4_4_ = fVar234 * auVar167._4_4_;
  auVar78._8_4_ = fVar235 * auVar167._8_4_;
  auVar78._12_4_ = fVar236 * auVar167._12_4_;
  auVar293 = vfmsub231ps_fma(auVar78,auVar19,auVar20);
  fVar100 = fVar100 - auVar21._0_4_;
  local_7a0 = auVar56._0_4_;
  fStack_79c = auVar56._4_4_;
  fStack_798 = auVar56._8_4_;
  auVar113._0_4_ = local_7a0 * 0.16666667;
  auVar113._4_4_ = fStack_79c * 0.16666667;
  auVar113._8_4_ = fStack_798 * 0.16666667;
  auVar113._12_4_ = fVar70 * 0.16666667;
  auVar87 = vfmadd231ps_fma(auVar113,auVar166,auVar87);
  auVar19 = vfmadd231ps_fma(auVar74,auVar15,auVar166);
  auVar15 = vfmadd231ps_fma(auVar87,auVar15,auVar148);
  auVar21 = vfmadd231ps_fma(auVar19,auVar14,auVar148);
  auVar22 = vfmadd231ps_fma(auVar15,auVar14,ZEXT816(0));
  auVar87 = vpermilps_avx(auVar72,0xc9);
  auVar14 = vdpps_avx(auVar87,auVar87,0x7f);
  fVar99 = auVar14._0_4_;
  auVar167 = ZEXT416((uint)fVar99);
  auVar15 = vrsqrtss_avx(auVar167,auVar167);
  fVar70 = auVar15._0_4_;
  auVar19 = vpermilps_avx(auVar73,0xc9);
  auVar15 = vdpps_avx(auVar87,auVar19,0x7f);
  fVar70 = fVar99 * -0.5 * fVar70 * fVar70 * fVar70 + fVar70 * 1.5;
  auVar240._0_4_ = fVar99 * auVar19._0_4_;
  auVar240._4_4_ = fVar99 * auVar19._4_4_;
  auVar240._8_4_ = fVar99 * auVar19._8_4_;
  auVar240._12_4_ = fVar99 * auVar19._12_4_;
  fVar99 = auVar15._0_4_;
  auVar186._0_4_ = fVar99 * auVar87._0_4_;
  auVar186._4_4_ = fVar99 * auVar87._4_4_;
  auVar186._8_4_ = fVar99 * auVar87._8_4_;
  auVar186._12_4_ = fVar99 * auVar87._12_4_;
  auVar19 = vsubps_avx(auVar240,auVar186);
  auVar15 = vrcpss_avx(auVar167,auVar167);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar146 = auVar15._0_4_ * auVar14._0_4_;
  auVar167 = vpermilps_avx(auVar103,0xc9);
  auVar15 = vdpps_avx(auVar167,auVar167,0x7f);
  fVar129 = auVar87._0_4_ * fVar70;
  fVar142 = auVar87._4_4_ * fVar70;
  fVar143 = auVar87._8_4_ * fVar70;
  fVar144 = auVar87._12_4_ * fVar70;
  auVar14 = vblendps_avx(auVar15,_DAT_01f7aa10,0xe);
  auVar87 = vrsqrtss_avx(auVar14,auVar14);
  fVar147 = auVar15._0_4_;
  fVar99 = auVar87._0_4_;
  fVar99 = fVar99 * 1.5 + fVar147 * -0.5 * fVar99 * fVar99 * fVar99;
  auVar20 = vpermilps_avx(auVar104,0xc9);
  auVar87 = vdpps_avx(auVar167,auVar20,0x7f);
  auVar221._0_4_ = auVar20._0_4_ * fVar147;
  auVar221._4_4_ = auVar20._4_4_ * fVar147;
  auVar221._8_4_ = auVar20._8_4_ * fVar147;
  auVar221._12_4_ = auVar20._12_4_ * fVar147;
  fVar147 = auVar87._0_4_;
  auVar305._0_4_ = fVar147 * auVar167._0_4_;
  auVar305._4_4_ = fVar147 * auVar167._4_4_;
  auVar305._8_4_ = fVar147 * auVar167._8_4_;
  auVar305._12_4_ = fVar147 * auVar167._12_4_;
  auVar87 = vsubps_avx(auVar221,auVar305);
  auVar14 = vrcpss_avx(auVar14,auVar14);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar14,ZEXT416(0x40000000));
  fVar147 = auVar14._0_4_ * auVar15._0_4_;
  fVar164 = auVar167._0_4_ * fVar99;
  fVar180 = auVar167._4_4_ * fVar99;
  fVar181 = auVar167._8_4_ * fVar99;
  fVar182 = auVar167._12_4_ * fVar99;
  auVar14 = vshufps_avx(auVar130,auVar130,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar241._0_4_ = auVar15._0_4_ * fVar129;
  auVar241._4_4_ = auVar15._4_4_ * fVar142;
  auVar241._8_4_ = auVar15._8_4_ * fVar143;
  auVar241._12_4_ = auVar15._12_4_ * fVar144;
  auVar79._0_4_ = auVar14._0_4_ * fVar129 + auVar15._0_4_ * fVar70 * fVar146 * auVar19._0_4_;
  auVar79._4_4_ = auVar14._4_4_ * fVar142 + auVar15._4_4_ * fVar70 * fVar146 * auVar19._4_4_;
  auVar79._8_4_ = auVar14._8_4_ * fVar143 + auVar15._8_4_ * fVar70 * fVar146 * auVar19._8_4_;
  auVar79._12_4_ = auVar14._12_4_ * fVar144 + auVar15._12_4_ * fVar70 * fVar146 * auVar19._12_4_;
  auVar19 = vsubps_avx(auVar21,auVar241);
  local_730._0_4_ = auVar21._0_4_ + auVar241._0_4_;
  local_730._4_4_ = auVar21._4_4_ + auVar241._4_4_;
  fStack_728 = auVar21._8_4_ + auVar241._8_4_;
  fStack_724 = auVar21._12_4_ + auVar241._12_4_;
  auVar167 = vsubps_avx(auVar130,auVar79);
  auVar14 = vshufps_avx(auVar131,auVar131,0xff);
  auVar15 = vshufps_avx(auVar22,auVar22,0xff);
  auVar168._0_4_ = auVar15._0_4_ * fVar164;
  auVar168._4_4_ = auVar15._4_4_ * fVar180;
  auVar168._8_4_ = auVar15._8_4_ * fVar181;
  auVar168._12_4_ = auVar15._12_4_ * fVar182;
  auVar151._0_4_ = auVar14._0_4_ * fVar164 + auVar15._0_4_ * fVar99 * auVar87._0_4_ * fVar147;
  auVar151._4_4_ = auVar14._4_4_ * fVar180 + auVar15._4_4_ * fVar99 * auVar87._4_4_ * fVar147;
  auVar151._8_4_ = auVar14._8_4_ * fVar181 + auVar15._8_4_ * fVar99 * auVar87._8_4_ * fVar147;
  auVar151._12_4_ = auVar14._12_4_ * fVar182 + auVar15._12_4_ * fVar99 * auVar87._12_4_ * fVar147;
  auVar87 = vsubps_avx(auVar22,auVar168);
  local_700._4_4_ = auVar22._4_4_ + auVar168._4_4_;
  local_700._0_4_ = auVar22._0_4_ + auVar168._0_4_;
  fStack_6f8 = auVar22._8_4_ + auVar168._8_4_;
  fStack_6f4 = auVar22._12_4_ + auVar168._12_4_;
  auVar20 = vsubps_avx(auVar131,auVar151);
  auVar80._8_4_ = 0x3e2aaaab;
  auVar80._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar80._12_4_ = 0x3e2aaaab;
  auVar306._0_4_ = local_770 * 0.16666667;
  auVar306._4_4_ = fStack_76c * 0.16666667;
  auVar306._8_4_ = fStack_768 * 0.16666667;
  auVar306._12_4_ = fVar145 * 0.16666667;
  auVar132._8_4_ = 0x3f2aaaab;
  auVar132._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar132._12_4_ = 0x3f2aaaab;
  auVar14 = vfmadd231ps_fma(auVar306,auVar132,auVar17);
  auVar15 = vfmadd231ps_fma(auVar75,auVar18,auVar132);
  auVar14 = vfmadd231ps_fma(auVar14,auVar18,auVar80);
  auVar21 = vfmadd231ps_fma(auVar15,auVar169,auVar80);
  auVar22 = vfmadd231ps_fma(auVar14,auVar169,ZEXT816(0) << 0x20);
  auVar18 = vpermilps_avx(auVar105,0xc9);
  auVar14 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar99 = auVar14._0_4_;
  auVar169 = ZEXT416((uint)fVar99);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar15 = vrsqrtss_avx(auVar169,auVar169);
  fVar70 = auVar15._0_4_;
  auVar17 = vpermilps_avx(auVar30,0xc9);
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  fVar70 = fVar70 * 1.5 + fVar70 * fVar70 * fVar99 * -0.5 * fVar70;
  auVar222._0_4_ = auVar17._0_4_ * fVar99;
  auVar222._4_4_ = auVar17._4_4_ * fVar99;
  auVar222._8_4_ = auVar17._8_4_ * fVar99;
  auVar222._12_4_ = auVar17._12_4_ * fVar99;
  fVar99 = auVar15._0_4_;
  auVar242._0_4_ = fVar99 * auVar18._0_4_;
  auVar242._4_4_ = fVar99 * auVar18._4_4_;
  auVar242._8_4_ = fVar99 * auVar18._8_4_;
  auVar242._12_4_ = fVar99 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar222,auVar242);
  auVar15 = vrcpss_avx(auVar169,auVar169);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar146 = auVar15._0_4_ * auVar14._0_4_;
  auVar169 = vpermilps_avx(auVar111,0xc9);
  auVar14 = vdpps_avx(auVar169,auVar169,0x7f);
  fVar145 = auVar18._0_4_ * fVar70;
  fVar129 = auVar18._4_4_ * fVar70;
  fVar142 = auVar18._8_4_ * fVar70;
  fVar143 = auVar18._12_4_ * fVar70;
  fVar147 = auVar14._0_4_;
  auVar170._4_12_ = SUB1612(auVar270 << 0x40,4);
  auVar170._0_4_ = fVar147;
  auVar15 = vrsqrtss_avx(auVar170,auVar170);
  fVar99 = auVar15._0_4_;
  fVar99 = fVar147 * -0.5 * fVar99 * fVar99 * fVar99 + fVar99 * 1.5;
  auVar18 = vpermilps_avx(auVar293,0xc9);
  auVar15 = vdpps_avx(auVar169,auVar18,0x7f);
  auVar281._0_4_ = fVar147 * auVar18._0_4_;
  auVar281._4_4_ = fVar147 * auVar18._4_4_;
  auVar281._8_4_ = fVar147 * auVar18._8_4_;
  auVar281._12_4_ = fVar147 * auVar18._12_4_;
  fVar147 = auVar15._0_4_;
  auVar319._0_4_ = fVar147 * auVar169._0_4_;
  auVar319._4_4_ = fVar147 * auVar169._4_4_;
  auVar319._8_4_ = fVar147 * auVar169._8_4_;
  auVar319._12_4_ = fVar147 * auVar169._12_4_;
  auVar18 = vsubps_avx(auVar281,auVar319);
  auVar15 = vrcpss_avx(auVar170,auVar170);
  auVar14 = vfnmadd213ss_fma(auVar14,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar147 = auVar14._0_4_ * auVar15._0_4_;
  fVar144 = auVar169._0_4_ * fVar99;
  fVar164 = auVar169._4_4_ * fVar99;
  fVar180 = auVar169._8_4_ * fVar99;
  fVar181 = auVar169._12_4_ * fVar99;
  auVar14 = vshufps_avx(auVar165,auVar165,0xff);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar152._0_4_ = auVar15._0_4_ * fVar145;
  auVar152._4_4_ = auVar15._4_4_ * fVar129;
  auVar152._8_4_ = auVar15._8_4_ * fVar142;
  auVar152._12_4_ = auVar15._12_4_ * fVar143;
  auVar114._0_4_ = auVar14._0_4_ * fVar145 + auVar15._0_4_ * fVar70 * fVar146 * auVar17._0_4_;
  auVar114._4_4_ = auVar14._4_4_ * fVar129 + auVar15._4_4_ * fVar70 * fVar146 * auVar17._4_4_;
  auVar114._8_4_ = auVar14._8_4_ * fVar142 + auVar15._8_4_ * fVar70 * fVar146 * auVar17._8_4_;
  auVar114._12_4_ = auVar14._12_4_ * fVar143 + auVar15._12_4_ * fVar70 * fVar146 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar21,auVar152);
  fVar146 = auVar21._0_4_ + auVar152._0_4_;
  fVar145 = auVar21._4_4_ + auVar152._4_4_;
  fVar129 = auVar21._8_4_ + auVar152._8_4_;
  fVar142 = auVar21._12_4_ + auVar152._12_4_;
  auVar169 = vsubps_avx(auVar165,auVar114);
  auVar14 = vshufps_avx(auVar183,auVar183,0xff);
  auVar15 = vshufps_avx(auVar22,auVar22,0xff);
  auVar255._0_4_ = auVar15._0_4_ * fVar144;
  auVar255._4_4_ = auVar15._4_4_ * fVar164;
  auVar255._8_4_ = auVar15._8_4_ * fVar180;
  auVar255._12_4_ = auVar15._12_4_ * fVar181;
  auVar115._0_4_ = auVar14._0_4_ * fVar144 + auVar15._0_4_ * fVar99 * auVar18._0_4_ * fVar147;
  auVar115._4_4_ = auVar14._4_4_ * fVar164 + auVar15._4_4_ * fVar99 * auVar18._4_4_ * fVar147;
  auVar115._8_4_ = auVar14._8_4_ * fVar180 + auVar15._8_4_ * fVar99 * auVar18._8_4_ * fVar147;
  auVar115._12_4_ = auVar14._12_4_ * fVar181 + auVar15._12_4_ * fVar99 * auVar18._12_4_ * fVar147;
  auVar14 = vsubps_avx(auVar22,auVar255);
  auVar171._0_4_ = auVar22._0_4_ + auVar255._0_4_;
  auVar171._4_4_ = auVar22._4_4_ + auVar255._4_4_;
  auVar171._8_4_ = auVar22._8_4_ + auVar255._8_4_;
  auVar171._12_4_ = auVar22._12_4_ + auVar255._12_4_;
  auVar15 = vsubps_avx(auVar183,auVar115);
  local_620 = auVar167._0_4_;
  fStack_61c = auVar167._4_4_;
  fStack_618 = auVar167._8_4_;
  fStack_614 = auVar167._12_4_;
  auVar204._0_4_ = auVar19._0_4_ + local_620 * 0.33333334;
  auVar204._4_4_ = auVar19._4_4_ + fStack_61c * 0.33333334;
  auVar204._8_4_ = auVar19._8_4_ + fStack_618 * 0.33333334;
  auVar204._12_4_ = auVar19._12_4_ + fStack_614 * 0.33333334;
  fVar70 = 1.0 - fVar100;
  auVar116._4_4_ = fVar70;
  auVar116._0_4_ = fVar70;
  auVar116._8_4_ = fVar70;
  auVar116._12_4_ = fVar70;
  auVar282._0_4_ = fVar100 * auVar17._0_4_;
  auVar282._4_4_ = fVar100 * auVar17._4_4_;
  auVar282._8_4_ = fVar100 * auVar17._8_4_;
  auVar282._12_4_ = fVar100 * auVar17._12_4_;
  auVar21 = vfmadd231ps_fma(auVar282,auVar116,auVar19);
  auVar81._0_4_ = fVar100 * (auVar17._0_4_ + auVar169._0_4_ * 0.33333334);
  auVar81._4_4_ = fVar100 * (auVar17._4_4_ + auVar169._4_4_ * 0.33333334);
  auVar81._8_4_ = fVar100 * (auVar17._8_4_ + auVar169._8_4_ * 0.33333334);
  auVar81._12_4_ = fVar100 * (auVar17._12_4_ + auVar169._12_4_ * 0.33333334);
  auVar22 = vfmadd231ps_fma(auVar81,auVar116,auVar204);
  local_660._0_4_ = auVar20._0_4_;
  local_660._4_4_ = auVar20._4_4_;
  uStack_658._0_4_ = auVar20._8_4_;
  uStack_658._4_4_ = auVar20._12_4_;
  auVar133._0_4_ = (float)local_660._0_4_ * 0.33333334;
  auVar133._4_4_ = (float)local_660._4_4_ * 0.33333334;
  auVar133._8_4_ = (float)uStack_658 * 0.33333334;
  auVar133._12_4_ = uStack_658._4_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar87,auVar133);
  auVar307._0_4_ = (float)local_730._0_4_ + (fVar279 + auVar79._0_4_) * 0.33333334;
  auVar307._4_4_ = (float)local_730._4_4_ + (fVar289 + auVar79._4_4_) * 0.33333334;
  auVar307._8_4_ = fStack_728 + (fVar290 + auVar79._8_4_) * 0.33333334;
  auVar307._12_4_ = fStack_724 + (fVar101 + auVar79._12_4_) * 0.33333334;
  auVar268._0_4_ = (fVar291 + auVar151._0_4_) * 0.33333334;
  auVar268._4_4_ = (fVar302 + auVar151._4_4_) * 0.33333334;
  auVar268._8_4_ = (fVar303 + auVar151._8_4_) * 0.33333334;
  auVar268._12_4_ = (fVar304 + auVar151._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_700,auVar268);
  auVar283._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar283._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar283._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar283._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar14,auVar283);
  auVar243._0_4_ = (fVar233 + auVar115._0_4_) * 0.33333334;
  auVar243._4_4_ = (fVar234 + auVar115._4_4_) * 0.33333334;
  auVar243._8_4_ = (fVar235 + auVar115._8_4_) * 0.33333334;
  auVar243._12_4_ = (fVar236 + auVar115._12_4_) * 0.33333334;
  auVar169 = vsubps_avx(auVar171,auVar243);
  auVar284._0_4_ = fVar100 * auVar15._0_4_;
  auVar284._4_4_ = fVar100 * auVar15._4_4_;
  auVar284._8_4_ = fVar100 * auVar15._8_4_;
  auVar284._12_4_ = fVar100 * auVar15._12_4_;
  auVar223._0_4_ = fVar100 * auVar14._0_4_;
  auVar223._4_4_ = fVar100 * auVar14._4_4_;
  auVar223._8_4_ = fVar100 * auVar14._8_4_;
  auVar223._12_4_ = fVar100 * auVar14._12_4_;
  auVar30 = vfmadd231ps_fma(auVar284,auVar116,auVar17);
  auVar74 = vfmadd231ps_fma(auVar223,auVar116,auVar87);
  auVar134._0_4_ = fVar100 * fVar146;
  auVar134._4_4_ = fVar100 * fVar145;
  auVar134._8_4_ = fVar100 * fVar129;
  auVar134._12_4_ = fVar100 * fVar142;
  auVar153._0_4_ = fVar100 * (fVar146 + (fVar237 + auVar114._0_4_) * 0.33333334);
  auVar153._4_4_ = fVar100 * (fVar145 + (fVar253 + auVar114._4_4_) * 0.33333334);
  auVar153._8_4_ = fVar100 * (fVar129 + (fVar265 + auVar114._8_4_) * 0.33333334);
  auVar153._12_4_ = fVar100 * (fVar142 + (fVar266 + auVar114._12_4_) * 0.33333334);
  auVar187._0_4_ = fVar100 * auVar169._0_4_;
  auVar187._4_4_ = fVar100 * auVar169._4_4_;
  auVar187._8_4_ = fVar100 * auVar169._8_4_;
  auVar187._12_4_ = fVar100 * auVar169._12_4_;
  auVar172._0_4_ = fVar100 * auVar171._0_4_;
  auVar172._4_4_ = fVar100 * auVar171._4_4_;
  auVar172._8_4_ = fVar100 * auVar171._8_4_;
  auVar172._12_4_ = fVar100 * auVar171._12_4_;
  auVar75 = vfmadd231ps_fma(auVar134,auVar116,_local_730);
  auVar72 = vfmadd231ps_fma(auVar153,auVar116,auVar307);
  auVar73 = vfmadd231ps_fma(auVar187,auVar116,auVar18);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar103 = vfmadd231ps_fma(auVar172,auVar116,_local_700);
  auVar167 = vsubps_avx(auVar21,auVar14);
  auVar15 = vshufps_avx(auVar167,auVar167,0x55);
  auVar87 = vshufps_avx(auVar167,auVar167,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar70 = pre->ray_space[k].vz.field_0.m128[0];
  fVar99 = pre->ray_space[k].vz.field_0.m128[1];
  fVar100 = pre->ray_space[k].vz.field_0.m128[2];
  fVar146 = pre->ray_space[k].vz.field_0.m128[3];
  auVar82._0_4_ = fVar70 * auVar87._0_4_;
  auVar82._4_4_ = fVar99 * auVar87._4_4_;
  auVar82._8_4_ = fVar100 * auVar87._8_4_;
  auVar82._12_4_ = fVar146 * auVar87._12_4_;
  auVar17 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar15);
  auVar20 = vsubps_avx(auVar22,auVar14);
  auVar15 = vshufps_avx(auVar20,auVar20,0x55);
  auVar87 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar328._0_4_ = fVar70 * auVar87._0_4_;
  auVar328._4_4_ = fVar99 * auVar87._4_4_;
  auVar328._8_4_ = fVar100 * auVar87._8_4_;
  auVar328._12_4_ = fVar146 * auVar87._12_4_;
  auVar87 = vfmadd231ps_fma(auVar328,(undefined1  [16])aVar5,auVar15);
  local_3a0 = vsubps_avx(auVar30,auVar14);
  auVar15 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar308._0_4_ = fVar70 * auVar15._0_4_;
  auVar308._4_4_ = fVar99 * auVar15._4_4_;
  auVar308._8_4_ = fVar100 * auVar15._8_4_;
  auVar308._12_4_ = fVar146 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3a0,local_3a0,0x55);
  auVar18 = vfmadd231ps_fma(auVar308,(undefined1  [16])aVar5,auVar15);
  local_3b0 = vsubps_avx(auVar74,auVar14);
  auVar15 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar320._0_4_ = fVar70 * auVar15._0_4_;
  auVar320._4_4_ = fVar99 * auVar15._4_4_;
  auVar320._8_4_ = fVar100 * auVar15._8_4_;
  auVar320._12_4_ = fVar146 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3b0,local_3b0,0x55);
  auVar169 = vfmadd231ps_fma(auVar320,(undefined1  [16])aVar5,auVar15);
  local_3c0 = vsubps_avx(auVar75,auVar14);
  auVar15 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar173._0_4_ = fVar70 * auVar15._0_4_;
  auVar173._4_4_ = fVar99 * auVar15._4_4_;
  auVar173._8_4_ = fVar100 * auVar15._8_4_;
  auVar173._12_4_ = fVar146 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3c0,local_3c0,0x55);
  auVar19 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar15);
  local_3d0 = vsubps_avx(auVar72,auVar14);
  auVar15 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar224._0_4_ = fVar70 * auVar15._0_4_;
  auVar224._4_4_ = fVar99 * auVar15._4_4_;
  auVar224._8_4_ = fVar100 * auVar15._8_4_;
  auVar224._12_4_ = fVar146 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3d0,local_3d0,0x55);
  auVar104 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar15);
  local_3e0 = vsubps_avx(auVar73,auVar14);
  auVar15 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar256._0_4_ = fVar70 * auVar15._0_4_;
  auVar256._4_4_ = fVar99 * auVar15._4_4_;
  auVar256._8_4_ = fVar100 * auVar15._8_4_;
  auVar256._12_4_ = fVar146 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar15 = vfmadd231ps_fma(auVar256,(undefined1  [16])aVar5,auVar15);
  local_3f0 = vsubps_avx(auVar103,auVar14);
  auVar14 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar188._0_4_ = fVar70 * auVar14._0_4_;
  auVar188._4_4_ = fVar99 * auVar14._4_4_;
  auVar188._8_4_ = fVar100 * auVar14._8_4_;
  auVar188._12_4_ = fVar146 * auVar14._12_4_;
  auVar14 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar14 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar5,auVar14);
  local_4d0 = auVar167._0_4_;
  auVar205._4_4_ = local_4d0;
  auVar205._0_4_ = local_4d0;
  auVar205._8_4_ = local_4d0;
  auVar205._12_4_ = local_4d0;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar105 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar205);
  local_4e0 = auVar20._0_4_;
  auVar206._4_4_ = local_4e0;
  auVar206._0_4_ = local_4e0;
  auVar206._8_4_ = local_4e0;
  auVar206._12_4_ = local_4e0;
  auVar111 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar206);
  uVar71 = local_3a0._0_4_;
  auVar207._4_4_ = uVar71;
  auVar207._0_4_ = uVar71;
  auVar207._8_4_ = uVar71;
  auVar207._12_4_ = uVar71;
  auVar293 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar207);
  uVar71 = local_3b0._0_4_;
  auVar208._4_4_ = uVar71;
  auVar208._0_4_ = uVar71;
  auVar208._8_4_ = uVar71;
  auVar208._12_4_ = uVar71;
  auVar130 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar208);
  uVar71 = local_3c0._0_4_;
  auVar209._4_4_ = uVar71;
  auVar209._0_4_ = uVar71;
  auVar209._8_4_ = uVar71;
  auVar209._12_4_ = uVar71;
  auVar131 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar5,auVar209);
  uVar71 = local_3d0._0_4_;
  auVar210._4_4_ = uVar71;
  auVar210._0_4_ = uVar71;
  auVar210._8_4_ = uVar71;
  auVar210._12_4_ = uVar71;
  auVar104 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar5,auVar210);
  uVar71 = local_3e0._0_4_;
  auVar211._4_4_ = uVar71;
  auVar211._0_4_ = uVar71;
  auVar211._8_4_ = uVar71;
  auVar211._12_4_ = uVar71;
  auVar165 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar211);
  uVar71 = local_3f0._0_4_;
  auVar212._4_4_ = uVar71;
  auVar212._0_4_ = uVar71;
  auVar212._8_4_ = uVar71;
  auVar212._12_4_ = uVar71;
  auVar183 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar212);
  auVar17 = vmovlhps_avx(auVar105,auVar131);
  auVar18 = vmovlhps_avx(auVar111,auVar104);
  auVar169 = vmovlhps_avx(auVar293,auVar165);
  auVar19 = vmovlhps_avx(auVar130,auVar183);
  auVar14 = vminps_avx(auVar17,auVar18);
  auVar15 = vminps_avx(auVar169,auVar19);
  auVar87 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar17,auVar18);
  auVar15 = vmaxps_avx(auVar169,auVar19);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vshufpd_avx(auVar87,auVar87,3);
  auVar87 = vminps_avx(auVar87,auVar15);
  auVar15 = vshufpd_avx(auVar14,auVar14,3);
  auVar15 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vandps_avx(auVar327,auVar87);
  auVar15 = vandps_avx(auVar15,auVar327);
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar15 = vmovshdup_avx(auVar14);
  auVar14 = vmaxss_avx(auVar15,auVar14);
  local_588 = uVar58 + 0xf;
  fVar99 = auVar14._0_4_ * 9.536743e-07;
  auVar244._8_8_ = auVar105._0_8_;
  auVar244._0_8_ = auVar105._0_8_;
  auVar269._8_8_ = auVar111._0_8_;
  auVar269._0_8_ = auVar111._0_8_;
  auVar309._0_8_ = auVar293._0_8_;
  auVar309._8_8_ = auVar309._0_8_;
  auVar321._0_8_ = auVar130._0_8_;
  auVar321._8_8_ = auVar321._0_8_;
  local_360 = -fVar99;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_2c0 = uVar63;
  uStack_2bc = uVar63;
  uStack_2b8 = uVar63;
  uStack_2b4 = uVar63;
  uStack_2b0 = uVar63;
  uStack_2ac = uVar63;
  uStack_2a8 = uVar63;
  uStack_2a4 = uVar63;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  bVar69 = false;
  uVar68 = 0;
  fVar70 = *(float *)(ray + k * 4 + 0x60);
  local_370 = vsubps_avx(auVar18,auVar17);
  local_380 = vsubps_avx(auVar169,auVar18);
  local_390 = vsubps_avx(auVar19,auVar169);
  local_420 = vsubps_avx(auVar75,auVar21);
  local_430 = vsubps_avx(auVar72,auVar22);
  local_440 = vsubps_avx(auVar73,auVar30);
  _local_450 = vsubps_avx(auVar103,auVar74);
  auVar334 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar232 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_340 = fVar99;
  fStack_33c = fVar99;
  fStack_338 = fVar99;
  fStack_334 = fVar99;
  fStack_330 = fVar99;
  fStack_32c = fVar99;
  fStack_328 = fVar99;
  fStack_324 = fVar99;
LAB_016e1a9a:
  local_400 = auVar232._0_16_;
  auVar189 = auVar334._0_16_;
  auVar14 = vshufps_avx(auVar189,auVar189,0x50);
  auVar329._8_4_ = 0x3f800000;
  auVar329._0_8_ = 0x3f8000003f800000;
  auVar329._12_4_ = 0x3f800000;
  auVar332._16_4_ = 0x3f800000;
  auVar332._0_16_ = auVar329;
  auVar332._20_4_ = 0x3f800000;
  auVar332._24_4_ = 0x3f800000;
  auVar332._28_4_ = 0x3f800000;
  auVar15 = vsubps_avx(auVar329,auVar14);
  fVar100 = auVar14._0_4_;
  fVar164 = auVar131._0_4_;
  auVar83._0_4_ = fVar164 * fVar100;
  fVar146 = auVar14._4_4_;
  fVar180 = auVar131._4_4_;
  auVar83._4_4_ = fVar180 * fVar146;
  fVar147 = auVar14._8_4_;
  auVar83._8_4_ = fVar164 * fVar147;
  fVar145 = auVar14._12_4_;
  auVar83._12_4_ = fVar180 * fVar145;
  fVar253 = auVar104._0_4_;
  auVar213._0_4_ = fVar253 * fVar100;
  fVar265 = auVar104._4_4_;
  auVar213._4_4_ = fVar265 * fVar146;
  auVar213._8_4_ = fVar253 * fVar147;
  auVar213._12_4_ = fVar265 * fVar145;
  fVar266 = auVar165._0_4_;
  auVar174._0_4_ = fVar266 * fVar100;
  fVar279 = auVar165._4_4_;
  auVar174._4_4_ = fVar279 * fVar146;
  auVar174._8_4_ = fVar266 * fVar147;
  auVar174._12_4_ = fVar279 * fVar145;
  fVar289 = auVar183._0_4_;
  auVar135._0_4_ = fVar289 * fVar100;
  fVar290 = auVar183._4_4_;
  auVar135._4_4_ = fVar290 * fVar146;
  auVar135._8_4_ = fVar289 * fVar147;
  auVar135._12_4_ = fVar290 * fVar145;
  auVar111 = vfmadd231ps_fma(auVar83,auVar15,auVar244);
  auVar293 = vfmadd231ps_fma(auVar213,auVar15,auVar269);
  auVar130 = vfmadd231ps_fma(auVar174,auVar15,auVar309);
  auVar201 = vfmadd231ps_fma(auVar135,auVar321,auVar15);
  auVar14 = vmovshdup_avx(auVar232._0_16_);
  fVar100 = auVar232._0_4_;
  fStack_228 = (auVar14._0_4_ - fVar100) * 0.04761905;
  auVar264._4_4_ = fVar100;
  auVar264._0_4_ = fVar100;
  auVar264._8_4_ = fVar100;
  auVar264._12_4_ = fVar100;
  auVar264._16_4_ = fVar100;
  auVar264._20_4_ = fVar100;
  auVar264._24_4_ = fVar100;
  auVar264._28_4_ = fVar100;
  auVar124._0_8_ = auVar14._0_8_;
  auVar124._8_8_ = auVar124._0_8_;
  auVar124._16_8_ = auVar124._0_8_;
  auVar124._24_8_ = auVar124._0_8_;
  auVar95 = vsubps_avx(auVar124,auVar264);
  uVar71 = auVar111._0_4_;
  auVar325._4_4_ = uVar71;
  auVar325._0_4_ = uVar71;
  auVar325._8_4_ = uVar71;
  auVar325._12_4_ = uVar71;
  auVar325._16_4_ = uVar71;
  auVar325._20_4_ = uVar71;
  auVar325._24_4_ = uVar71;
  auVar325._28_4_ = uVar71;
  auVar14 = vmovshdup_avx(auVar111);
  uVar102 = auVar14._0_8_;
  auVar315._8_8_ = uVar102;
  auVar315._0_8_ = uVar102;
  auVar315._16_8_ = uVar102;
  auVar315._24_8_ = uVar102;
  fVar181 = auVar293._0_4_;
  auVar299._4_4_ = fVar181;
  auVar299._0_4_ = fVar181;
  auVar299._8_4_ = fVar181;
  auVar299._12_4_ = fVar181;
  auVar299._16_4_ = fVar181;
  auVar299._20_4_ = fVar181;
  auVar299._24_4_ = fVar181;
  auVar299._28_4_ = fVar181;
  auVar15 = vmovshdup_avx(auVar293);
  auVar125._0_8_ = auVar15._0_8_;
  auVar125._8_8_ = auVar125._0_8_;
  auVar125._16_8_ = auVar125._0_8_;
  auVar125._24_8_ = auVar125._0_8_;
  fVar144 = auVar130._0_4_;
  auVar229._4_4_ = fVar144;
  auVar229._0_4_ = fVar144;
  auVar229._8_4_ = fVar144;
  auVar229._12_4_ = fVar144;
  auVar229._16_4_ = fVar144;
  auVar229._20_4_ = fVar144;
  auVar229._24_4_ = fVar144;
  auVar229._28_4_ = fVar144;
  auVar87 = vmovshdup_avx(auVar130);
  auVar250._0_8_ = auVar87._0_8_;
  auVar250._8_8_ = auVar250._0_8_;
  auVar250._16_8_ = auVar250._0_8_;
  auVar250._24_8_ = auVar250._0_8_;
  fVar143 = auVar201._0_4_;
  auVar105 = vmovshdup_avx(auVar201);
  auVar285 = vfmadd132ps_fma(auVar95,auVar264,_DAT_01faff20);
  auVar95 = vsubps_avx(auVar332,ZEXT1632(auVar285));
  fVar100 = auVar285._0_4_;
  fVar146 = auVar285._4_4_;
  auVar24._4_4_ = fVar181 * fVar146;
  auVar24._0_4_ = fVar181 * fVar100;
  fVar147 = auVar285._8_4_;
  auVar24._8_4_ = fVar181 * fVar147;
  fVar145 = auVar285._12_4_;
  auVar24._12_4_ = fVar181 * fVar145;
  auVar24._16_4_ = fVar181 * 0.0;
  auVar24._20_4_ = fVar181 * 0.0;
  auVar24._24_4_ = fVar181 * 0.0;
  auVar24._28_4_ = 0x3f800000;
  auVar285 = vfmadd231ps_fma(auVar24,auVar95,auVar325);
  fVar129 = auVar15._0_4_;
  fVar142 = auVar15._4_4_;
  auVar23._4_4_ = fVar142 * fVar146;
  auVar23._0_4_ = fVar129 * fVar100;
  auVar23._8_4_ = fVar129 * fVar147;
  auVar23._12_4_ = fVar142 * fVar145;
  auVar23._16_4_ = fVar129 * 0.0;
  auVar23._20_4_ = fVar142 * 0.0;
  auVar23._24_4_ = fVar129 * 0.0;
  auVar23._28_4_ = uVar71;
  auVar218 = vfmadd231ps_fma(auVar23,auVar95,auVar315);
  auVar16._4_4_ = fVar144 * fVar146;
  auVar16._0_4_ = fVar144 * fVar100;
  auVar16._8_4_ = fVar144 * fVar147;
  auVar16._12_4_ = fVar144 * fVar145;
  auVar16._16_4_ = fVar144 * 0.0;
  auVar16._20_4_ = fVar144 * 0.0;
  auVar16._24_4_ = fVar144 * 0.0;
  auVar16._28_4_ = auVar14._4_4_;
  auVar219 = vfmadd231ps_fma(auVar16,auVar95,auVar299);
  fVar129 = auVar87._0_4_;
  fVar142 = auVar87._4_4_;
  auVar25._4_4_ = fVar142 * fVar146;
  auVar25._0_4_ = fVar129 * fVar100;
  auVar25._8_4_ = fVar129 * fVar147;
  auVar25._12_4_ = fVar142 * fVar145;
  auVar25._16_4_ = fVar129 * 0.0;
  auVar25._20_4_ = fVar142 * 0.0;
  auVar25._24_4_ = fVar129 * 0.0;
  auVar25._28_4_ = fVar181;
  auVar155 = vfmadd231ps_fma(auVar25,auVar95,auVar125);
  auVar14 = vshufps_avx(auVar111,auVar111,0xaa);
  local_6e0._8_8_ = auVar14._0_8_;
  local_6e0._0_8_ = local_6e0._8_8_;
  local_6e0._16_8_ = local_6e0._8_8_;
  local_6e0._24_8_ = local_6e0._8_8_;
  auVar15 = vshufps_avx(auVar111,auVar111,0xff);
  uStack_758 = auVar15._0_8_;
  local_760 = (undefined1  [8])uStack_758;
  uStack_750 = uStack_758;
  uStack_748 = uStack_758;
  auVar26._4_4_ = fVar143 * fVar146;
  auVar26._0_4_ = fVar143 * fVar100;
  auVar26._8_4_ = fVar143 * fVar147;
  auVar26._12_4_ = fVar143 * fVar145;
  auVar26._16_4_ = fVar143 * 0.0;
  auVar26._20_4_ = fVar143 * 0.0;
  auVar26._24_4_ = fVar143 * 0.0;
  auVar26._28_4_ = fVar143;
  auVar111 = vfmadd231ps_fma(auVar26,auVar95,auVar229);
  auVar15 = vshufps_avx(auVar293,auVar293,0xaa);
  auVar230._0_8_ = auVar15._0_8_;
  auVar230._8_8_ = auVar230._0_8_;
  auVar230._16_8_ = auVar230._0_8_;
  auVar230._24_8_ = auVar230._0_8_;
  auVar87 = vshufps_avx(auVar293,auVar293,0xff);
  uStack_658 = auVar87._0_8_;
  local_660 = (undefined1  [8])uStack_658;
  uStack_650 = uStack_658;
  uStack_648 = uStack_658;
  fVar129 = auVar105._0_4_;
  fVar142 = auVar105._4_4_;
  auVar27._4_4_ = fVar142 * fVar146;
  auVar27._0_4_ = fVar129 * fVar100;
  auVar27._8_4_ = fVar129 * fVar147;
  auVar27._12_4_ = fVar142 * fVar145;
  auVar27._16_4_ = fVar129 * 0.0;
  auVar27._20_4_ = fVar142 * 0.0;
  auVar27._24_4_ = fVar129 * 0.0;
  auVar27._28_4_ = auVar14._4_4_;
  auVar238 = vfmadd231ps_fma(auVar27,auVar95,auVar250);
  auVar28._28_4_ = fVar142;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar219._12_4_ * fVar145,
                          CONCAT48(auVar219._8_4_ * fVar147,
                                   CONCAT44(auVar219._4_4_ * fVar146,auVar219._0_4_ * fVar100))));
  auVar285 = vfmadd231ps_fma(auVar28,auVar95,ZEXT1632(auVar285));
  fVar129 = auVar87._4_4_;
  auVar29._28_4_ = fVar129;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar155._12_4_ * fVar145,
                          CONCAT48(auVar155._8_4_ * fVar147,
                                   CONCAT44(auVar155._4_4_ * fVar146,auVar155._0_4_ * fVar100))));
  auVar218 = vfmadd231ps_fma(auVar29,auVar95,ZEXT1632(auVar218));
  auVar14 = vshufps_avx(auVar130,auVar130,0xaa);
  uVar102 = auVar14._0_8_;
  auVar217._8_8_ = uVar102;
  auVar217._0_8_ = uVar102;
  auVar217._16_8_ = uVar102;
  auVar217._24_8_ = uVar102;
  auVar105 = vshufps_avx(auVar130,auVar130,0xff);
  uVar102 = auVar105._0_8_;
  auVar333._8_8_ = uVar102;
  auVar333._0_8_ = uVar102;
  auVar333._16_8_ = uVar102;
  auVar333._24_8_ = uVar102;
  auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar111._12_4_ * fVar145,
                                                CONCAT48(auVar111._8_4_ * fVar147,
                                                         CONCAT44(auVar111._4_4_ * fVar146,
                                                                  auVar111._0_4_ * fVar100)))),
                             auVar95,ZEXT1632(auVar219));
  auVar111 = vshufps_avx(auVar201,auVar201,0xaa);
  auVar293 = vshufps_avx(auVar201,auVar201,0xff);
  auVar201 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar145 * auVar238._12_4_,
                                                CONCAT48(fVar147 * auVar238._8_4_,
                                                         CONCAT44(fVar146 * auVar238._4_4_,
                                                                  fVar100 * auVar238._0_4_)))),
                             auVar95,ZEXT1632(auVar155));
  auVar219 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar145 * auVar130._12_4_,
                                                CONCAT48(fVar147 * auVar130._8_4_,
                                                         CONCAT44(fVar146 * auVar130._4_4_,
                                                                  fVar100 * auVar130._0_4_)))),
                             auVar95,ZEXT1632(auVar285));
  auVar24 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar285));
  auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar145 * auVar201._12_4_,
                                                CONCAT48(fVar147 * auVar201._8_4_,
                                                         CONCAT44(fVar146 * auVar201._4_4_,
                                                                  fVar100 * auVar201._0_4_)))),
                             auVar95,ZEXT1632(auVar218));
  auVar96 = vsubps_avx(ZEXT1632(auVar201),ZEXT1632(auVar218));
  fStack_624 = auVar96._28_4_;
  auVar300._0_4_ = fStack_228 * auVar24._0_4_ * 3.0;
  auVar300._4_4_ = fStack_228 * auVar24._4_4_ * 3.0;
  auVar300._8_4_ = fStack_228 * auVar24._8_4_ * 3.0;
  auVar300._12_4_ = fStack_228 * auVar24._12_4_ * 3.0;
  auVar300._16_4_ = fStack_228 * auVar24._16_4_ * 3.0;
  auVar300._20_4_ = fStack_228 * auVar24._20_4_ * 3.0;
  auVar300._24_4_ = fStack_228 * auVar24._24_4_ * 3.0;
  auVar300._28_4_ = 0;
  local_640._0_4_ = fStack_228 * auVar96._0_4_ * 3.0;
  local_640._4_4_ = fStack_228 * auVar96._4_4_ * 3.0;
  fStack_638 = fStack_228 * auVar96._8_4_ * 3.0;
  fStack_634 = fStack_228 * auVar96._12_4_ * 3.0;
  fStack_630 = fStack_228 * auVar96._16_4_ * 3.0;
  fStack_62c = fStack_228 * auVar96._20_4_ * 3.0;
  fStack_628 = fStack_228 * auVar96._24_4_ * 3.0;
  fVar142 = auVar15._0_4_;
  fVar143 = auVar15._4_4_;
  auVar251._4_4_ = fVar143 * fVar146;
  auVar251._0_4_ = fVar142 * fVar100;
  auVar251._8_4_ = fVar142 * fVar147;
  auVar251._12_4_ = fVar143 * fVar145;
  auVar251._16_4_ = fVar142 * 0.0;
  auVar251._20_4_ = fVar143 * 0.0;
  auVar251._24_4_ = fVar142 * 0.0;
  auVar251._28_4_ = fStack_624;
  auVar15 = vfmadd231ps_fma(auVar251,auVar95,local_6e0);
  fVar142 = auVar87._0_4_;
  auVar301._4_4_ = fVar129 * fVar146;
  auVar301._0_4_ = fVar142 * fVar100;
  auVar301._8_4_ = fVar142 * fVar147;
  auVar301._12_4_ = fVar129 * fVar145;
  auVar301._16_4_ = fVar142 * 0.0;
  auVar301._20_4_ = fVar129 * 0.0;
  auVar301._24_4_ = fVar142 * 0.0;
  auVar301._28_4_ = 0;
  auVar87 = vfmadd231ps_fma(auVar301,auVar95,_local_760);
  fVar129 = auVar14._0_4_;
  fVar142 = auVar14._4_4_;
  auVar31._4_4_ = fVar142 * fVar146;
  auVar31._0_4_ = fVar129 * fVar100;
  auVar31._8_4_ = fVar129 * fVar147;
  auVar31._12_4_ = fVar142 * fVar145;
  auVar31._16_4_ = fVar129 * 0.0;
  auVar31._20_4_ = fVar142 * 0.0;
  auVar31._24_4_ = fVar129 * 0.0;
  auVar31._28_4_ = auVar24._28_4_;
  auVar14 = vfmadd231ps_fma(auVar31,auVar95,auVar230);
  fVar129 = auVar105._0_4_;
  fVar144 = auVar105._4_4_;
  auVar32._4_4_ = fVar144 * fVar146;
  auVar32._0_4_ = fVar129 * fVar100;
  auVar32._8_4_ = fVar129 * fVar147;
  auVar32._12_4_ = fVar144 * fVar145;
  auVar32._16_4_ = fVar129 * 0.0;
  auVar32._20_4_ = fVar144 * 0.0;
  auVar32._24_4_ = fVar129 * 0.0;
  auVar32._28_4_ = fVar143;
  auVar105 = vfmadd231ps_fma(auVar32,auVar95,_local_660);
  auVar25 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar219));
  fVar129 = auVar111._0_4_;
  fVar142 = auVar111._4_4_;
  auVar33._4_4_ = fVar142 * fVar146;
  auVar33._0_4_ = fVar129 * fVar100;
  auVar33._8_4_ = fVar129 * fVar147;
  auVar33._12_4_ = fVar142 * fVar145;
  auVar33._16_4_ = fVar129 * 0.0;
  auVar33._20_4_ = fVar142 * 0.0;
  auVar33._24_4_ = fVar129 * 0.0;
  auVar33._28_4_ = fVar142;
  auVar111 = vfmadd231ps_fma(auVar33,auVar95,auVar217);
  auVar26 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar130));
  fVar129 = auVar293._0_4_;
  fVar142 = auVar293._4_4_;
  auVar34._4_4_ = fVar142 * fVar146;
  auVar34._0_4_ = fVar129 * fVar100;
  auVar34._8_4_ = fVar129 * fVar147;
  auVar34._12_4_ = fVar142 * fVar145;
  auVar34._16_4_ = fVar129 * 0.0;
  auVar34._20_4_ = fVar142 * 0.0;
  auVar34._24_4_ = fVar129 * 0.0;
  auVar34._28_4_ = fVar142;
  auVar293 = vfmadd231ps_fma(auVar34,auVar95,auVar333);
  auVar35._28_4_ = fVar144;
  auVar35._0_28_ =
       ZEXT1628(CONCAT412(auVar14._12_4_ * fVar145,
                          CONCAT48(auVar14._8_4_ * fVar147,
                                   CONCAT44(auVar14._4_4_ * fVar146,auVar14._0_4_ * fVar100))));
  auVar15 = vfmadd231ps_fma(auVar35,auVar95,ZEXT1632(auVar15));
  auVar87 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar145 * auVar105._12_4_,
                                               CONCAT48(fVar147 * auVar105._8_4_,
                                                        CONCAT44(fVar146 * auVar105._4_4_,
                                                                 fVar100 * auVar105._0_4_)))),
                            auVar95,ZEXT1632(auVar87));
  auVar126._0_4_ = auVar219._0_4_ + auVar300._0_4_;
  auVar126._4_4_ = auVar219._4_4_ + auVar300._4_4_;
  auVar126._8_4_ = auVar219._8_4_ + auVar300._8_4_;
  auVar126._12_4_ = auVar219._12_4_ + auVar300._12_4_;
  auVar126._16_4_ = auVar300._16_4_ + 0.0;
  auVar126._20_4_ = auVar300._20_4_ + 0.0;
  auVar126._24_4_ = auVar300._24_4_ + 0.0;
  auVar126._28_4_ = 0;
  auVar14 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar111._12_4_ * fVar145,
                                               CONCAT48(auVar111._8_4_ * fVar147,
                                                        CONCAT44(auVar111._4_4_ * fVar146,
                                                                 auVar111._0_4_ * fVar100)))),
                            auVar95,ZEXT1632(auVar14));
  auVar105 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar293._12_4_ * fVar145,
                                                CONCAT48(auVar293._8_4_ * fVar147,
                                                         CONCAT44(auVar293._4_4_ * fVar146,
                                                                  auVar293._0_4_ * fVar100)))),
                             auVar95,ZEXT1632(auVar105));
  auVar111 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar145 * auVar14._12_4_,
                                                CONCAT48(fVar147 * auVar14._8_4_,
                                                         CONCAT44(fVar146 * auVar14._4_4_,
                                                                  fVar100 * auVar14._0_4_)))),
                             auVar95,ZEXT1632(auVar15));
  auVar293 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar105._12_4_ * fVar145,
                                                CONCAT48(auVar105._8_4_ * fVar147,
                                                         CONCAT44(auVar105._4_4_ * fVar146,
                                                                  auVar105._0_4_ * fVar100)))),
                             ZEXT1632(auVar87),auVar95);
  auVar95 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
  auVar24 = vsubps_avx(ZEXT1632(auVar105),ZEXT1632(auVar87));
  auVar326._0_4_ = fStack_228 * auVar95._0_4_ * 3.0;
  auVar326._4_4_ = fStack_228 * auVar95._4_4_ * 3.0;
  auVar326._8_4_ = fStack_228 * auVar95._8_4_ * 3.0;
  auVar326._12_4_ = fStack_228 * auVar95._12_4_ * 3.0;
  auVar326._16_4_ = fStack_228 * auVar95._16_4_ * 3.0;
  auVar326._20_4_ = fStack_228 * auVar95._20_4_ * 3.0;
  auVar326._24_4_ = fStack_228 * auVar95._24_4_ * 3.0;
  auVar326._28_4_ = 0;
  local_240 = fStack_228 * auVar24._0_4_ * 3.0;
  fStack_23c = fStack_228 * auVar24._4_4_ * 3.0;
  auVar36._4_4_ = fStack_23c;
  auVar36._0_4_ = local_240;
  fStack_238 = fStack_228 * auVar24._8_4_ * 3.0;
  auVar36._8_4_ = fStack_238;
  fStack_234 = fStack_228 * auVar24._12_4_ * 3.0;
  auVar36._12_4_ = fStack_234;
  fStack_230 = fStack_228 * auVar24._16_4_ * 3.0;
  auVar36._16_4_ = fStack_230;
  fStack_22c = fStack_228 * auVar24._20_4_ * 3.0;
  auVar36._20_4_ = fStack_22c;
  fStack_228 = fStack_228 * auVar24._24_4_ * 3.0;
  auVar36._24_4_ = fStack_228;
  auVar36._28_4_ = 0x40400000;
  auVar27 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar111));
  auVar28 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar293));
  auVar95 = vsubps_avx(ZEXT1632(auVar111),ZEXT1632(auVar219));
  auVar24 = vsubps_avx(ZEXT1632(auVar293),ZEXT1632(auVar130));
  auVar96 = vsubps_avx(auVar27,auVar25);
  fVar181 = auVar95._0_4_ + auVar96._0_4_;
  fVar182 = auVar95._4_4_ + auVar96._4_4_;
  fVar233 = auVar95._8_4_ + auVar96._8_4_;
  fVar234 = auVar95._12_4_ + auVar96._12_4_;
  fVar235 = auVar95._16_4_ + auVar96._16_4_;
  fVar236 = auVar95._20_4_ + auVar96._20_4_;
  fVar237 = auVar95._24_4_ + auVar96._24_4_;
  auVar23 = vsubps_avx(auVar28,auVar26);
  auVar97._0_4_ = auVar24._0_4_ + auVar23._0_4_;
  auVar97._4_4_ = auVar24._4_4_ + auVar23._4_4_;
  auVar97._8_4_ = auVar24._8_4_ + auVar23._8_4_;
  auVar97._12_4_ = auVar24._12_4_ + auVar23._12_4_;
  auVar97._16_4_ = auVar24._16_4_ + auVar23._16_4_;
  auVar97._20_4_ = auVar24._20_4_ + auVar23._20_4_;
  auVar97._24_4_ = auVar24._24_4_ + auVar23._24_4_;
  auVar97._28_4_ = auVar24._28_4_ + auVar23._28_4_;
  local_1e0 = ZEXT1632(auVar130);
  fVar100 = auVar130._0_4_;
  local_260 = (float)local_640._0_4_ + fVar100;
  fVar146 = auVar130._4_4_;
  fStack_25c = (float)local_640._4_4_ + fVar146;
  fVar147 = auVar130._8_4_;
  fStack_258 = fStack_638 + fVar147;
  fVar145 = auVar130._12_4_;
  fStack_254 = fStack_634 + fVar145;
  fStack_250 = fStack_630 + 0.0;
  fStack_24c = fStack_62c + 0.0;
  fStack_248 = fStack_628 + 0.0;
  auVar251 = ZEXT1632(auVar219);
  auVar24 = vsubps_avx(auVar251,auVar300);
  local_1c0 = vpermps_avx2(_DAT_01fec480,auVar24);
  auVar24 = vsubps_avx(local_1e0,_local_640);
  local_280 = vpermps_avx2(_DAT_01fec480,auVar24);
  local_200._0_4_ = auVar111._0_4_ + auVar326._0_4_;
  local_200._4_4_ = auVar111._4_4_ + auVar326._4_4_;
  local_200._8_4_ = auVar111._8_4_ + auVar326._8_4_;
  local_200._12_4_ = auVar111._12_4_ + auVar326._12_4_;
  local_200._16_4_ = auVar326._16_4_ + 0.0;
  local_200._20_4_ = auVar326._20_4_ + 0.0;
  local_200._24_4_ = auVar326._24_4_ + 0.0;
  local_200._28_4_ = 0;
  auVar301 = ZEXT1632(auVar111);
  auVar24 = vsubps_avx(auVar301,auVar326);
  auVar29 = vpermps_avx2(_DAT_01fec480,auVar24);
  fVar129 = auVar293._0_4_;
  local_240 = fVar129 + local_240;
  fVar142 = auVar293._4_4_;
  fStack_23c = fVar142 + fStack_23c;
  fVar143 = auVar293._8_4_;
  fStack_238 = fVar143 + fStack_238;
  fVar144 = auVar293._12_4_;
  fStack_234 = fVar144 + fStack_234;
  fStack_230 = fStack_230 + 0.0;
  fStack_22c = fStack_22c + 0.0;
  fStack_228 = fStack_228 + 0.0;
  auVar24 = vsubps_avx(ZEXT1632(auVar293),auVar36);
  local_220 = vpermps_avx2(_DAT_01fec480,auVar24);
  auVar37._4_4_ = fVar146 * fVar182;
  auVar37._0_4_ = fVar100 * fVar181;
  auVar37._8_4_ = fVar147 * fVar233;
  auVar37._12_4_ = fVar145 * fVar234;
  auVar37._16_4_ = fVar235 * 0.0;
  auVar37._20_4_ = fVar236 * 0.0;
  auVar37._24_4_ = fVar237 * 0.0;
  auVar37._28_4_ = auVar24._28_4_;
  auVar14 = vfnmadd231ps_fma(auVar37,auVar251,auVar97);
  fStack_244 = fStack_624 + 0.0;
  auVar38._4_4_ = fStack_25c * fVar182;
  auVar38._0_4_ = local_260 * fVar181;
  auVar38._8_4_ = fStack_258 * fVar233;
  auVar38._12_4_ = fStack_254 * fVar234;
  auVar38._16_4_ = fStack_250 * fVar235;
  auVar38._20_4_ = fStack_24c * fVar236;
  auVar38._24_4_ = fStack_248 * fVar237;
  auVar38._28_4_ = 0;
  auVar15 = vfnmadd231ps_fma(auVar38,auVar97,auVar126);
  auVar39._4_4_ = local_280._4_4_ * fVar182;
  auVar39._0_4_ = local_280._0_4_ * fVar181;
  auVar39._8_4_ = local_280._8_4_ * fVar233;
  auVar39._12_4_ = local_280._12_4_ * fVar234;
  auVar39._16_4_ = local_280._16_4_ * fVar235;
  auVar39._20_4_ = local_280._20_4_ * fVar236;
  auVar39._24_4_ = local_280._24_4_ * fVar237;
  auVar39._28_4_ = fStack_624 + 0.0;
  auVar87 = vfnmadd231ps_fma(auVar39,local_1c0,auVar97);
  local_760._0_4_ = auVar26._0_4_;
  local_760._4_4_ = auVar26._4_4_;
  uStack_758._0_4_ = auVar26._8_4_;
  uStack_758._4_4_ = auVar26._12_4_;
  uStack_750._0_4_ = auVar26._16_4_;
  uStack_750._4_4_ = auVar26._20_4_;
  uStack_748._0_4_ = auVar26._24_4_;
  uStack_748._4_4_ = auVar26._28_4_;
  auVar40._4_4_ = (float)local_760._4_4_ * fVar182;
  auVar40._0_4_ = (float)local_760._0_4_ * fVar181;
  auVar40._8_4_ = (float)uStack_758 * fVar233;
  auVar40._12_4_ = uStack_758._4_4_ * fVar234;
  auVar40._16_4_ = (float)uStack_750 * fVar235;
  auVar40._20_4_ = uStack_750._4_4_ * fVar236;
  auVar40._24_4_ = (float)uStack_748 * fVar237;
  auVar40._28_4_ = uStack_748._4_4_;
  auVar105 = vfnmadd231ps_fma(auVar40,auVar25,auVar97);
  auVar252._0_4_ = fVar129 * fVar181;
  auVar252._4_4_ = fVar142 * fVar182;
  auVar252._8_4_ = fVar143 * fVar233;
  auVar252._12_4_ = fVar144 * fVar234;
  auVar252._16_4_ = fVar235 * 0.0;
  auVar252._20_4_ = fVar236 * 0.0;
  auVar252._24_4_ = fVar237 * 0.0;
  auVar252._28_4_ = 0;
  auVar111 = vfnmadd231ps_fma(auVar252,auVar301,auVar97);
  uStack_224 = 0x40400000;
  auVar41._4_4_ = fStack_23c * fVar182;
  auVar41._0_4_ = local_240 * fVar181;
  auVar41._8_4_ = fStack_238 * fVar233;
  auVar41._12_4_ = fStack_234 * fVar234;
  auVar41._16_4_ = fStack_230 * fVar235;
  auVar41._20_4_ = fStack_22c * fVar236;
  auVar41._24_4_ = fStack_228 * fVar237;
  auVar41._28_4_ = auVar25._28_4_;
  auVar130 = vfnmadd231ps_fma(auVar41,local_200,auVar97);
  auVar42._4_4_ = local_220._4_4_ * fVar182;
  auVar42._0_4_ = local_220._0_4_ * fVar181;
  auVar42._8_4_ = local_220._8_4_ * fVar233;
  auVar42._12_4_ = local_220._12_4_ * fVar234;
  auVar42._16_4_ = local_220._16_4_ * fVar235;
  auVar42._20_4_ = local_220._20_4_ * fVar236;
  auVar42._24_4_ = local_220._24_4_ * fVar237;
  auVar42._28_4_ = local_220._28_4_;
  auVar201 = vfnmadd231ps_fma(auVar42,auVar29,auVar97);
  auVar43._4_4_ = auVar28._4_4_ * fVar182;
  auVar43._0_4_ = auVar28._0_4_ * fVar181;
  auVar43._8_4_ = auVar28._8_4_ * fVar233;
  auVar43._12_4_ = auVar28._12_4_ * fVar234;
  auVar43._16_4_ = auVar28._16_4_ * fVar235;
  auVar43._20_4_ = auVar28._20_4_ * fVar236;
  auVar43._24_4_ = auVar28._24_4_ * fVar237;
  auVar43._28_4_ = auVar95._28_4_ + auVar96._28_4_;
  auVar285 = vfnmadd231ps_fma(auVar43,auVar27,auVar97);
  auVar24 = vminps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
  auVar95 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
  auVar96 = vminps_avx(ZEXT1632(auVar87),ZEXT1632(auVar105));
  auVar96 = vminps_avx(auVar24,auVar96);
  auVar24 = vmaxps_avx(ZEXT1632(auVar87),ZEXT1632(auVar105));
  auVar95 = vmaxps_avx(auVar95,auVar24);
  auVar23 = vminps_avx(ZEXT1632(auVar111),ZEXT1632(auVar130));
  auVar24 = vmaxps_avx(ZEXT1632(auVar111),ZEXT1632(auVar130));
  auVar16 = vminps_avx(ZEXT1632(auVar201),ZEXT1632(auVar285));
  auVar23 = vminps_avx(auVar23,auVar16);
  auVar23 = vminps_avx(auVar96,auVar23);
  auVar96 = vmaxps_avx(ZEXT1632(auVar201),ZEXT1632(auVar285));
  auVar24 = vmaxps_avx(auVar24,auVar96);
  auVar24 = vmaxps_avx(auVar95,auVar24);
  auVar54._4_4_ = fStack_33c;
  auVar54._0_4_ = local_340;
  auVar54._8_4_ = fStack_338;
  auVar54._12_4_ = fStack_334;
  auVar54._16_4_ = fStack_330;
  auVar54._20_4_ = fStack_32c;
  auVar54._24_4_ = fStack_328;
  auVar54._28_4_ = fStack_324;
  auVar95 = vcmpps_avx(auVar23,auVar54,2);
  auVar52._4_4_ = fStack_35c;
  auVar52._0_4_ = local_360;
  auVar52._8_4_ = fStack_358;
  auVar52._12_4_ = fStack_354;
  auVar52._16_4_ = fStack_350;
  auVar52._20_4_ = fStack_34c;
  auVar52._24_4_ = fStack_348;
  auVar52._28_4_ = fStack_344;
  auVar24 = vcmpps_avx(auVar24,auVar52,5);
  auVar95 = vandps_avx(auVar24,auVar95);
  auVar24 = local_2a0 & auVar95;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar24 = vsubps_avx(auVar25,auVar251);
    auVar96 = vsubps_avx(auVar27,auVar301);
    fVar182 = auVar24._0_4_ + auVar96._0_4_;
    fVar233 = auVar24._4_4_ + auVar96._4_4_;
    fVar234 = auVar24._8_4_ + auVar96._8_4_;
    fVar235 = auVar24._12_4_ + auVar96._12_4_;
    fVar236 = auVar24._16_4_ + auVar96._16_4_;
    fVar237 = auVar24._20_4_ + auVar96._20_4_;
    fVar101 = auVar24._24_4_ + auVar96._24_4_;
    auVar23 = vsubps_avx(auVar26,local_1e0);
    auVar16 = vsubps_avx(auVar28,ZEXT1632(auVar293));
    auVar127._0_4_ = auVar23._0_4_ + auVar16._0_4_;
    auVar127._4_4_ = auVar23._4_4_ + auVar16._4_4_;
    auVar127._8_4_ = auVar23._8_4_ + auVar16._8_4_;
    auVar127._12_4_ = auVar23._12_4_ + auVar16._12_4_;
    auVar127._16_4_ = auVar23._16_4_ + auVar16._16_4_;
    auVar127._20_4_ = auVar23._20_4_ + auVar16._20_4_;
    auVar127._24_4_ = auVar23._24_4_ + auVar16._24_4_;
    fVar181 = auVar16._28_4_;
    auVar127._28_4_ = auVar23._28_4_ + fVar181;
    auVar44._4_4_ = fVar146 * fVar233;
    auVar44._0_4_ = fVar100 * fVar182;
    auVar44._8_4_ = fVar147 * fVar234;
    auVar44._12_4_ = fVar145 * fVar235;
    auVar44._16_4_ = fVar236 * 0.0;
    auVar44._20_4_ = fVar237 * 0.0;
    auVar44._24_4_ = fVar101 * 0.0;
    auVar44._28_4_ = auVar27._28_4_;
    auVar111 = vfnmadd231ps_fma(auVar44,auVar127,auVar251);
    auVar45._4_4_ = fVar233 * fStack_25c;
    auVar45._0_4_ = fVar182 * local_260;
    auVar45._8_4_ = fVar234 * fStack_258;
    auVar45._12_4_ = fVar235 * fStack_254;
    auVar45._16_4_ = fVar236 * fStack_250;
    auVar45._20_4_ = fVar237 * fStack_24c;
    auVar45._24_4_ = fVar101 * fStack_248;
    auVar45._28_4_ = 0;
    auVar14 = vfnmadd213ps_fma(auVar126,auVar127,auVar45);
    auVar46._4_4_ = fVar233 * local_280._4_4_;
    auVar46._0_4_ = fVar182 * local_280._0_4_;
    auVar46._8_4_ = fVar234 * local_280._8_4_;
    auVar46._12_4_ = fVar235 * local_280._12_4_;
    auVar46._16_4_ = fVar236 * local_280._16_4_;
    auVar46._20_4_ = fVar237 * local_280._20_4_;
    auVar46._24_4_ = fVar101 * local_280._24_4_;
    auVar46._28_4_ = 0;
    auVar15 = vfnmadd213ps_fma(local_1c0,auVar127,auVar46);
    auVar47._4_4_ = (float)local_760._4_4_ * fVar233;
    auVar47._0_4_ = (float)local_760._0_4_ * fVar182;
    auVar47._8_4_ = (float)uStack_758 * fVar234;
    auVar47._12_4_ = uStack_758._4_4_ * fVar235;
    auVar47._16_4_ = (float)uStack_750 * fVar236;
    auVar47._20_4_ = uStack_750._4_4_ * fVar237;
    auVar47._24_4_ = (float)uStack_748 * fVar101;
    auVar47._28_4_ = 0;
    auVar293 = vfnmadd231ps_fma(auVar47,auVar127,auVar25);
    auVar162._0_4_ = fVar129 * fVar182;
    auVar162._4_4_ = fVar142 * fVar233;
    auVar162._8_4_ = fVar143 * fVar234;
    auVar162._12_4_ = fVar144 * fVar235;
    auVar162._16_4_ = fVar236 * 0.0;
    auVar162._20_4_ = fVar237 * 0.0;
    auVar162._24_4_ = fVar101 * 0.0;
    auVar162._28_4_ = 0;
    auVar130 = vfnmadd231ps_fma(auVar162,auVar127,auVar301);
    auVar48._4_4_ = fVar233 * fStack_23c;
    auVar48._0_4_ = fVar182 * local_240;
    auVar48._8_4_ = fVar234 * fStack_238;
    auVar48._12_4_ = fVar235 * fStack_234;
    auVar48._16_4_ = fVar236 * fStack_230;
    auVar48._20_4_ = fVar237 * fStack_22c;
    auVar48._24_4_ = fVar101 * fStack_228;
    auVar48._28_4_ = fVar181;
    auVar87 = vfnmadd213ps_fma(local_200,auVar127,auVar48);
    auVar49._4_4_ = fVar233 * local_220._4_4_;
    auVar49._0_4_ = fVar182 * local_220._0_4_;
    auVar49._8_4_ = fVar234 * local_220._8_4_;
    auVar49._12_4_ = fVar235 * local_220._12_4_;
    auVar49._16_4_ = fVar236 * local_220._16_4_;
    auVar49._20_4_ = fVar237 * local_220._20_4_;
    auVar49._24_4_ = fVar101 * local_220._24_4_;
    auVar49._28_4_ = fVar181;
    auVar105 = vfnmadd213ps_fma(auVar29,auVar127,auVar49);
    auVar50._4_4_ = auVar28._4_4_ * fVar233;
    auVar50._0_4_ = auVar28._0_4_ * fVar182;
    auVar50._8_4_ = auVar28._8_4_ * fVar234;
    auVar50._12_4_ = auVar28._12_4_ * fVar235;
    auVar50._16_4_ = auVar28._16_4_ * fVar236;
    auVar50._20_4_ = auVar28._20_4_ * fVar237;
    auVar50._24_4_ = auVar28._24_4_ * fVar101;
    auVar50._28_4_ = auVar24._28_4_ + auVar96._28_4_;
    auVar201 = vfnmadd231ps_fma(auVar50,auVar27,auVar127);
    auVar96 = vminps_avx(ZEXT1632(auVar111),ZEXT1632(auVar14));
    auVar24 = vmaxps_avx(ZEXT1632(auVar111),ZEXT1632(auVar14));
    auVar23 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar293));
    auVar23 = vminps_avx(auVar96,auVar23);
    auVar96 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar293));
    auVar24 = vmaxps_avx(auVar24,auVar96);
    auVar16 = vminps_avx(ZEXT1632(auVar130),ZEXT1632(auVar87));
    auVar96 = vmaxps_avx(ZEXT1632(auVar130),ZEXT1632(auVar87));
    auVar25 = vminps_avx(ZEXT1632(auVar105),ZEXT1632(auVar201));
    auVar16 = vminps_avx(auVar16,auVar25);
    auVar16 = vminps_avx(auVar23,auVar16);
    auVar23 = vmaxps_avx(ZEXT1632(auVar105),ZEXT1632(auVar201));
    auVar96 = vmaxps_avx(auVar96,auVar23);
    auVar96 = vmaxps_avx(auVar24,auVar96);
    auVar55._4_4_ = fStack_33c;
    auVar55._0_4_ = local_340;
    auVar55._8_4_ = fStack_338;
    auVar55._12_4_ = fStack_334;
    auVar55._16_4_ = fStack_330;
    auVar55._20_4_ = fStack_32c;
    auVar55._24_4_ = fStack_328;
    auVar55._28_4_ = fStack_324;
    auVar24 = vcmpps_avx(auVar16,auVar55,2);
    auVar53._4_4_ = fStack_35c;
    auVar53._0_4_ = local_360;
    auVar53._8_4_ = fStack_358;
    auVar53._12_4_ = fStack_354;
    auVar53._16_4_ = fStack_350;
    auVar53._20_4_ = fStack_34c;
    auVar53._24_4_ = fStack_348;
    auVar53._28_4_ = fStack_344;
    auVar96 = vcmpps_avx(auVar96,auVar53,5);
    auVar24 = vandps_avx(auVar96,auVar24);
    auVar95 = vandps_avx(local_2a0,auVar95);
    auVar96 = auVar95 & auVar24;
    auVar334 = ZEXT864(0) << 0x20;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0x7f,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar96 >> 0xbf,0) == '\0') &&
        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f])
    goto LAB_016e2029;
    auVar95 = vandps_avx(auVar24,auVar95);
    uVar66 = vmovmskps_avx(auVar95);
    if (uVar66 == 0) goto LAB_016e2029;
    uVar65 = (ulong)uVar68;
    auStack_4c0[uVar65] = uVar66 & 0xff;
    uVar102 = vmovlps_avx(local_400);
    *(undefined8 *)(&uStack_320 + uVar65 * 2) = uVar102;
    uVar60 = vmovlps_avx(auVar189);
    auStack_1a0[uVar65] = uVar60;
    uVar68 = uVar68 + 1;
    goto LAB_016e2029;
  }
LAB_016e1ed3:
  auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
LAB_016e2029:
  if (uVar68 == 0) {
    if (bVar69) {
      return bVar69;
    }
    uVar71 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar94._4_4_ = uVar71;
    auVar94._0_4_ = uVar71;
    auVar94._8_4_ = uVar71;
    auVar94._12_4_ = uVar71;
    auVar14 = vcmpps_avx(local_410,auVar94,2);
    uVar63 = vmovmskps_avx(auVar14);
    uVar58 = uVar58 & local_588 & uVar63;
    if (uVar58 == 0) {
      return bVar69;
    }
    goto LAB_016e0dac;
  }
  uVar65 = (ulong)(uVar68 - 1);
  uVar62 = auStack_4c0[uVar65];
  uVar66 = (&uStack_320)[uVar65 * 2];
  fVar100 = afStack_31c[uVar65 * 2];
  iVar59 = 0;
  for (uVar60 = (ulong)uVar62; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    iVar59 = iVar59 + 1;
  }
  uVar62 = uVar62 - 1 & uVar62;
  if (uVar62 == 0) {
    uVar68 = uVar68 - 1;
  }
  auVar190._8_8_ = 0;
  auVar190._0_8_ = auStack_1a0[uVar65];
  auVar334 = ZEXT1664(auVar190);
  auStack_4c0[uVar65] = uVar62;
  fVar146 = (float)(iVar59 + 1) * 0.14285715;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * (float)iVar59 * 0.14285715)),ZEXT416(uVar66),
                            ZEXT416((uint)(1.0 - (float)iVar59 * 0.14285715)));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * fVar146)),ZEXT416(uVar66),
                            ZEXT416((uint)(1.0 - fVar146)));
  fVar146 = auVar15._0_4_;
  auVar231._0_4_ = auVar14._0_4_;
  fVar100 = fVar146 - auVar231._0_4_;
  if (0.16666667 <= fVar100) {
    auVar14 = vinsertps_avx(auVar14,auVar15,0x10);
    auVar232 = ZEXT1664(auVar14);
    goto LAB_016e1a9a;
  }
  auVar87 = vshufps_avx(auVar190,auVar190,0x50);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar105 = vsubps_avx(auVar117,auVar87);
  fVar147 = auVar87._0_4_;
  auVar175._0_4_ = fVar147 * fVar164;
  fVar145 = auVar87._4_4_;
  auVar175._4_4_ = fVar145 * fVar180;
  fVar129 = auVar87._8_4_;
  auVar175._8_4_ = fVar129 * fVar164;
  fVar142 = auVar87._12_4_;
  auVar175._12_4_ = fVar142 * fVar180;
  auVar191._0_4_ = fVar253 * fVar147;
  auVar191._4_4_ = fVar265 * fVar145;
  auVar191._8_4_ = fVar253 * fVar129;
  auVar191._12_4_ = fVar265 * fVar142;
  auVar214._0_4_ = fVar266 * fVar147;
  auVar214._4_4_ = fVar279 * fVar145;
  auVar214._8_4_ = fVar266 * fVar129;
  auVar214._12_4_ = fVar279 * fVar142;
  auVar84._0_4_ = fVar289 * fVar147;
  auVar84._4_4_ = fVar290 * fVar145;
  auVar84._8_4_ = fVar289 * fVar129;
  auVar84._12_4_ = fVar290 * fVar142;
  auVar87 = vfmadd231ps_fma(auVar175,auVar105,auVar244);
  auVar111 = vfmadd231ps_fma(auVar191,auVar105,auVar269);
  auVar293 = vfmadd231ps_fma(auVar214,auVar105,auVar309);
  auVar105 = vfmadd231ps_fma(auVar84,auVar105,auVar321);
  auVar163._16_16_ = auVar87;
  auVar163._0_16_ = auVar87;
  auVar179._16_16_ = auVar111;
  auVar179._0_16_ = auVar111;
  auVar200._16_16_ = auVar293;
  auVar200._0_16_ = auVar293;
  auVar231._4_4_ = auVar231._0_4_;
  auVar231._8_4_ = auVar231._0_4_;
  auVar231._12_4_ = auVar231._0_4_;
  auVar231._20_4_ = fVar146;
  auVar231._16_4_ = fVar146;
  auVar231._24_4_ = fVar146;
  auVar231._28_4_ = fVar146;
  auVar95 = vsubps_avx(auVar179,auVar163);
  auVar111 = vfmadd213ps_fma(auVar95,auVar231,auVar163);
  auVar95 = vsubps_avx(auVar200,auVar179);
  auVar130 = vfmadd213ps_fma(auVar95,auVar231,auVar179);
  auVar87 = vsubps_avx(auVar105,auVar293);
  auVar98._16_16_ = auVar87;
  auVar98._0_16_ = auVar87;
  auVar87 = vfmadd213ps_fma(auVar98,auVar231,auVar200);
  auVar95 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar111));
  auVar105 = vfmadd213ps_fma(auVar95,auVar231,ZEXT1632(auVar111));
  auVar95 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar130));
  auVar87 = vfmadd213ps_fma(auVar95,auVar231,ZEXT1632(auVar130));
  auVar95 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar105));
  auVar218 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar95,auVar231);
  fVar147 = fVar100 * 0.33333334;
  auVar225._0_8_ =
       CONCAT44(auVar218._4_4_ + fVar147 * auVar95._4_4_ * 3.0,
                auVar218._0_4_ + fVar147 * auVar95._0_4_ * 3.0);
  auVar225._8_4_ = auVar218._8_4_ + fVar147 * auVar95._8_4_ * 3.0;
  auVar225._12_4_ = auVar218._12_4_ + fVar147 * auVar95._12_4_ * 3.0;
  auVar105 = vshufpd_avx(auVar218,auVar218,3);
  auVar111 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
  auVar87 = vsubps_avx(auVar105,auVar218);
  auVar293 = vsubps_avx(auVar111,(undefined1  [16])0x0);
  auVar85._0_4_ = auVar87._0_4_ + auVar293._0_4_;
  auVar85._4_4_ = auVar87._4_4_ + auVar293._4_4_;
  auVar85._8_4_ = auVar87._8_4_ + auVar293._8_4_;
  auVar85._12_4_ = auVar87._12_4_ + auVar293._12_4_;
  auVar87 = vshufps_avx(auVar218,auVar218,0xb1);
  auVar293 = vshufps_avx(auVar225,auVar225,0xb1);
  auVar322._4_4_ = auVar85._0_4_;
  auVar322._0_4_ = auVar85._0_4_;
  auVar322._8_4_ = auVar85._0_4_;
  auVar322._12_4_ = auVar85._0_4_;
  auVar130 = vshufps_avx(auVar85,auVar85,0x55);
  fVar145 = auVar130._0_4_;
  auVar86._0_4_ = fVar145 * auVar87._0_4_;
  fVar129 = auVar130._4_4_;
  auVar86._4_4_ = fVar129 * auVar87._4_4_;
  fVar142 = auVar130._8_4_;
  auVar86._8_4_ = fVar142 * auVar87._8_4_;
  fVar143 = auVar130._12_4_;
  auVar86._12_4_ = fVar143 * auVar87._12_4_;
  auVar192._0_4_ = fVar145 * auVar293._0_4_;
  auVar192._4_4_ = fVar129 * auVar293._4_4_;
  auVar192._8_4_ = fVar142 * auVar293._8_4_;
  auVar192._12_4_ = fVar143 * auVar293._12_4_;
  auVar201 = vfmadd231ps_fma(auVar86,auVar322,auVar218);
  auVar285 = vfmadd231ps_fma(auVar192,auVar322,auVar225);
  auVar293 = vshufps_avx(auVar201,auVar201,0xe8);
  auVar130 = vshufps_avx(auVar285,auVar285,0xe8);
  auVar87 = vcmpps_avx(auVar293,auVar130,1);
  uVar66 = vextractps_avx(auVar87,0);
  auVar219 = auVar285;
  if ((uVar66 & 1) == 0) {
    auVar219 = auVar201;
  }
  auVar154._0_4_ = fVar147 * auVar95._16_4_ * 3.0;
  auVar154._4_4_ = fVar147 * auVar95._20_4_ * 3.0;
  auVar154._8_4_ = fVar147 * auVar95._24_4_ * 3.0;
  auVar154._12_4_ = fVar147 * 0.0;
  auVar267 = vsubps_avx((undefined1  [16])0x0,auVar154);
  auVar155 = vshufps_avx(auVar267,auVar267,0xb1);
  auVar238 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
  auVar226._0_4_ = fVar145 * auVar155._0_4_;
  auVar226._4_4_ = fVar129 * auVar155._4_4_;
  auVar226._8_4_ = fVar142 * auVar155._8_4_;
  auVar226._12_4_ = fVar143 * auVar155._12_4_;
  auVar245._0_4_ = auVar238._0_4_ * fVar145;
  auVar245._4_4_ = auVar238._4_4_ * fVar129;
  auVar245._8_4_ = auVar238._8_4_ * fVar142;
  auVar245._12_4_ = auVar238._12_4_ * fVar143;
  auVar316 = vfmadd231ps_fma(auVar226,auVar322,auVar267);
  auVar317 = vfmadd231ps_fma(auVar245,(undefined1  [16])0x0,auVar322);
  auVar238 = vshufps_avx(auVar316,auVar316,0xe8);
  auVar189 = vshufps_avx(auVar317,auVar317,0xe8);
  auVar155 = vcmpps_avx(auVar238,auVar189,1);
  uVar66 = vextractps_avx(auVar155,0);
  auVar270 = auVar317;
  if ((uVar66 & 1) == 0) {
    auVar270 = auVar316;
  }
  auVar219 = vmaxss_avx(auVar270,auVar219);
  auVar293 = vminps_avx(auVar293,auVar130);
  auVar130 = vminps_avx(auVar238,auVar189);
  auVar130 = vminps_avx(auVar293,auVar130);
  auVar87 = vshufps_avx(auVar87,auVar87,0x55);
  auVar87 = vblendps_avx(auVar87,auVar155,2);
  auVar155 = vpslld_avx(auVar87,0x1f);
  auVar87 = vshufpd_avx(auVar285,auVar285,1);
  auVar87 = vinsertps_avx(auVar87,auVar317,0x9c);
  auVar293 = vshufpd_avx(auVar201,auVar201,1);
  auVar293 = vinsertps_avx(auVar293,auVar316,0x9c);
  auVar87 = vblendvps_avx(auVar293,auVar87,auVar155);
  auVar293 = vmovshdup_avx(auVar87);
  auVar87 = vmaxss_avx(auVar293,auVar87);
  fVar142 = auVar130._0_4_;
  auVar293 = vmovshdup_avx(auVar130);
  fVar129 = auVar87._0_4_;
  fVar147 = auVar293._0_4_;
  fVar145 = auVar219._0_4_;
  if (((0.0001 <= fVar142) || (fVar129 <= -0.0001)) && (0.0001 <= fVar147 || fVar129 <= -0.0001)) {
    auVar293 = vcmpps_avx(auVar293,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar201 = vcmpps_avx(auVar130,SUB6416(ZEXT464(0x38d1b717),0),5);
    auVar293 = vandps_avx(auVar201,auVar293);
    if (fVar145 <= -0.0001 || (auVar293 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_016e1ed3;
  }
  auVar201 = vcmpps_avx(auVar130,_DAT_01f7aa10,1);
  auVar285 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar293 = vcmpss_avx(auVar219,ZEXT816(0) << 0x20,1);
  auVar136._8_4_ = 0xbf800000;
  auVar136._0_8_ = 0xbf800000bf800000;
  auVar136._12_4_ = 0xbf800000;
  auVar293 = vblendvps_avx(auVar117,auVar136,auVar293);
  auVar201 = vblendvps_avx(auVar117,auVar136,auVar201);
  fVar144 = auVar201._0_4_;
  fVar143 = auVar293._0_4_;
  auVar293 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar144 == fVar143) && (!NAN(fVar144) && !NAN(fVar143))) {
    auVar293 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar144 == fVar143) && (!NAN(fVar144) && !NAN(fVar143))) {
    auVar285 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar201 = vmovshdup_avx(auVar201);
  fVar181 = auVar201._0_4_;
  if ((fVar144 != fVar181) || (NAN(fVar144) || NAN(fVar181))) {
    if ((fVar147 != fVar142) || (NAN(fVar147) || NAN(fVar142))) {
      auVar156._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
      auVar156._8_4_ = auVar130._8_4_ ^ 0x80000000;
      auVar156._12_4_ = auVar130._12_4_ ^ 0x80000000;
      auVar157._0_4_ = -fVar142 / (fVar147 - fVar142);
      auVar157._4_12_ = auVar156._4_12_;
      auVar51._12_4_ = 0;
      auVar51._0_12_ = ZEXT812(0);
      auVar334 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar130 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar157._0_4_)),auVar51 << 0x20,auVar157);
      auVar201 = auVar130;
    }
    else {
      auVar130 = ZEXT816(0) << 0x20;
      auVar334 = ZEXT1264(ZEXT812(0)) << 0x20;
      if ((fVar142 != 0.0) || (auVar201 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar142))) {
        auVar130 = SUB6416(ZEXT464(0x7f800000),0);
        auVar201 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar293 = vminss_avx(auVar293,auVar130);
    auVar285 = vmaxss_avx(auVar201,auVar285);
  }
  else {
    auVar334 = ZEXT1264(ZEXT812(0)) << 0x20;
  }
  auVar130 = auVar334._0_16_;
  auVar87 = vcmpss_avx(auVar87,auVar130,1);
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar87 = vblendvps_avx(auVar117,auVar137,auVar87);
  fVar147 = auVar87._0_4_;
  if ((fVar143 != fVar147) || (NAN(fVar143) || NAN(fVar147))) {
    if ((fVar129 != fVar145) || (NAN(fVar129) || NAN(fVar145))) {
      auVar88._0_8_ = auVar219._0_8_ ^ 0x8000000080000000;
      auVar88._8_4_ = auVar219._8_4_ ^ 0x80000000;
      auVar88._12_4_ = auVar219._12_4_ ^ 0x80000000;
      auVar158._0_4_ = -fVar145 / (fVar129 - fVar145);
      auVar158._4_12_ = auVar88._4_12_;
      auVar87 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar158._0_4_)),auVar130,auVar158);
      auVar201 = auVar87;
    }
    else {
      auVar87 = ZEXT816(0) << 0x20;
      if ((fVar145 != 0.0) || (auVar201 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar145))) {
        auVar87 = SUB6416(ZEXT464(0x7f800000),0);
        auVar201 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar293 = vminss_avx(auVar293,auVar87);
    auVar285 = vmaxss_avx(auVar201,auVar285);
  }
  auVar87 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar181 != fVar147) || (NAN(fVar181) || NAN(fVar147))) {
    auVar293 = vminss_avx(auVar293,auVar87);
    auVar285 = vmaxss_avx(auVar87,auVar285);
  }
  auVar293 = vmaxss_avx(auVar130,auVar293);
  auVar201 = vminss_avx(auVar285,auVar87);
  if (auVar293._0_4_ <= auVar201._0_4_) {
    auVar293 = vmaxss_avx(auVar130,ZEXT416((uint)(auVar293._0_4_ + -0.1)));
    auVar87 = vminss_avx(ZEXT416((uint)(auVar201._0_4_ + 0.1)),auVar87);
    auVar176._0_8_ = auVar218._0_8_;
    auVar176._8_8_ = auVar176._0_8_;
    auVar257._8_8_ = auVar225._0_8_;
    auVar257._0_8_ = auVar225._0_8_;
    auVar271._8_8_ = auVar267._0_8_;
    auVar271._0_8_ = auVar267._0_8_;
    auVar130 = vshufpd_avx(auVar225,auVar225,3);
    auVar201 = vshufpd_avx(auVar267,auVar267,3);
    auVar285 = vshufps_avx(auVar293,auVar87,0);
    auVar218 = vsubps_avx(auVar117,auVar285);
    local_640._0_4_ = auVar105._0_4_;
    local_640._4_4_ = auVar105._4_4_;
    fStack_638 = auVar105._8_4_;
    fStack_634 = auVar105._12_4_;
    fVar147 = auVar285._0_4_;
    auVar89._0_4_ = fVar147 * (float)local_640._0_4_;
    fVar145 = auVar285._4_4_;
    auVar89._4_4_ = fVar145 * (float)local_640._4_4_;
    fVar129 = auVar285._8_4_;
    auVar89._8_4_ = fVar129 * fStack_638;
    fVar142 = auVar285._12_4_;
    auVar89._12_4_ = fVar142 * fStack_634;
    auVar215._0_4_ = fVar147 * auVar130._0_4_;
    auVar215._4_4_ = fVar145 * auVar130._4_4_;
    auVar215._8_4_ = fVar129 * auVar130._8_4_;
    auVar215._12_4_ = fVar142 * auVar130._12_4_;
    auVar227._0_4_ = fVar147 * auVar201._0_4_;
    auVar227._4_4_ = fVar145 * auVar201._4_4_;
    auVar227._8_4_ = fVar129 * auVar201._8_4_;
    auVar227._12_4_ = fVar142 * auVar201._12_4_;
    local_620 = auVar111._0_4_;
    fStack_61c = auVar111._4_4_;
    fStack_618 = auVar111._8_4_;
    fStack_614 = auVar111._12_4_;
    auVar246._0_4_ = fVar147 * local_620;
    auVar246._4_4_ = fVar145 * fStack_61c;
    auVar246._8_4_ = fVar129 * fStack_618;
    auVar246._12_4_ = fVar142 * fStack_614;
    auVar130 = vfmadd231ps_fma(auVar89,auVar218,auVar176);
    auVar201 = vfmadd231ps_fma(auVar215,auVar218,auVar257);
    auVar285 = vfmadd231ps_fma(auVar227,auVar218,auVar271);
    auVar218 = vfmadd231ps_fma(auVar246,auVar218,ZEXT816(0));
    auVar105 = vmovshdup_avx(auVar190);
    auVar267 = vfmadd231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar293._0_4_)),auVar190,
                               ZEXT416((uint)(1.0 - auVar293._0_4_)));
    auVar316 = vfmadd231ss_fma(ZEXT416((uint)(auVar105._0_4_ * auVar87._0_4_)),auVar190,
                               ZEXT416((uint)(1.0 - auVar87._0_4_)));
    fVar147 = 1.0 / fVar100;
    auVar87 = vsubps_avx(auVar201,auVar130);
    auVar258._0_4_ = auVar87._0_4_ * 3.0;
    auVar258._4_4_ = auVar87._4_4_ * 3.0;
    auVar258._8_4_ = auVar87._8_4_ * 3.0;
    auVar258._12_4_ = auVar87._12_4_ * 3.0;
    auVar87 = vsubps_avx(auVar285,auVar201);
    auVar272._0_4_ = auVar87._0_4_ * 3.0;
    auVar272._4_4_ = auVar87._4_4_ * 3.0;
    auVar272._8_4_ = auVar87._8_4_ * 3.0;
    auVar272._12_4_ = auVar87._12_4_ * 3.0;
    auVar87 = vsubps_avx(auVar218,auVar285);
    auVar286._0_4_ = auVar87._0_4_ * 3.0;
    auVar286._4_4_ = auVar87._4_4_ * 3.0;
    auVar286._8_4_ = auVar87._8_4_ * 3.0;
    auVar286._12_4_ = auVar87._12_4_ * 3.0;
    auVar105 = vminps_avx(auVar272,auVar286);
    auVar87 = vmaxps_avx(auVar272,auVar286);
    auVar105 = vminps_avx(auVar258,auVar105);
    auVar87 = vmaxps_avx(auVar258,auVar87);
    auVar111 = vshufpd_avx(auVar105,auVar105,3);
    auVar293 = vshufpd_avx(auVar87,auVar87,3);
    auVar105 = vminps_avx(auVar105,auVar111);
    auVar87 = vmaxps_avx(auVar87,auVar293);
    auVar273._0_4_ = auVar105._0_4_ * fVar147;
    auVar273._4_4_ = auVar105._4_4_ * fVar147;
    auVar273._8_4_ = auVar105._8_4_ * fVar147;
    auVar273._12_4_ = auVar105._12_4_ * fVar147;
    auVar259._0_4_ = auVar87._0_4_ * fVar147;
    auVar259._4_4_ = auVar87._4_4_ * fVar147;
    auVar259._8_4_ = auVar87._8_4_ * fVar147;
    auVar259._12_4_ = auVar87._12_4_ * fVar147;
    fVar147 = 1.0 / (auVar316._0_4_ - auVar267._0_4_);
    auVar87 = vshufpd_avx(auVar130,auVar130,3);
    auVar105 = vshufpd_avx(auVar201,auVar201,3);
    auVar111 = vshufpd_avx(auVar285,auVar285,3);
    auVar293 = vshufpd_avx(auVar218,auVar218,3);
    auVar87 = vsubps_avx(auVar87,auVar130);
    auVar130 = vsubps_avx(auVar105,auVar201);
    auVar201 = vsubps_avx(auVar111,auVar285);
    auVar293 = vsubps_avx(auVar293,auVar218);
    auVar105 = vminps_avx(auVar87,auVar130);
    auVar87 = vmaxps_avx(auVar87,auVar130);
    auVar111 = vminps_avx(auVar201,auVar293);
    auVar111 = vminps_avx(auVar105,auVar111);
    auVar105 = vmaxps_avx(auVar201,auVar293);
    auVar87 = vmaxps_avx(auVar87,auVar105);
    auVar310._0_4_ = fVar147 * auVar111._0_4_;
    auVar310._4_4_ = fVar147 * auVar111._4_4_;
    auVar310._8_4_ = fVar147 * auVar111._8_4_;
    auVar310._12_4_ = fVar147 * auVar111._12_4_;
    auVar294._0_4_ = fVar147 * auVar87._0_4_;
    auVar294._4_4_ = fVar147 * auVar87._4_4_;
    auVar294._8_4_ = fVar147 * auVar87._8_4_;
    auVar294._12_4_ = fVar147 * auVar87._12_4_;
    auVar293 = vinsertps_avx(auVar14,auVar267,0x10);
    auVar130 = vinsertps_avx(auVar15,auVar316,0x10);
    auVar287._0_4_ = (auVar293._0_4_ + auVar130._0_4_) * 0.5;
    auVar287._4_4_ = (auVar293._4_4_ + auVar130._4_4_) * 0.5;
    auVar287._8_4_ = (auVar293._8_4_ + auVar130._8_4_) * 0.5;
    auVar287._12_4_ = (auVar293._12_4_ + auVar130._12_4_) * 0.5;
    auVar90._4_4_ = auVar287._0_4_;
    auVar90._0_4_ = auVar287._0_4_;
    auVar90._8_4_ = auVar287._0_4_;
    auVar90._12_4_ = auVar287._0_4_;
    auVar87 = vfmadd213ps_fma(local_370,auVar90,auVar17);
    auVar105 = vfmadd213ps_fma(local_380,auVar90,auVar18);
    auVar111 = vfmadd213ps_fma(local_390,auVar90,auVar169);
    auVar15 = vsubps_avx(auVar105,auVar87);
    auVar87 = vfmadd213ps_fma(auVar15,auVar90,auVar87);
    auVar15 = vsubps_avx(auVar111,auVar105);
    auVar15 = vfmadd213ps_fma(auVar15,auVar90,auVar105);
    auVar15 = vsubps_avx(auVar15,auVar87);
    auVar87 = vfmadd231ps_fma(auVar87,auVar15,auVar90);
    auVar91._0_8_ = CONCAT44(auVar15._4_4_ * 3.0,auVar15._0_4_ * 3.0);
    auVar91._8_4_ = auVar15._8_4_ * 3.0;
    auVar91._12_4_ = auVar15._12_4_ * 3.0;
    auVar323._8_8_ = auVar87._0_8_;
    auVar323._0_8_ = auVar87._0_8_;
    auVar15 = vshufpd_avx(auVar87,auVar87,3);
    auVar87 = vshufps_avx(auVar287,auVar287,0x55);
    auVar285 = vsubps_avx(auVar15,auVar323);
    auVar219 = vfmadd231ps_fma(auVar323,auVar87,auVar285);
    auVar330._8_8_ = auVar91._0_8_;
    auVar330._0_8_ = auVar91._0_8_;
    auVar15 = vshufpd_avx(auVar91,auVar91,3);
    auVar15 = vsubps_avx(auVar15,auVar330);
    auVar218 = vfmadd213ps_fma(auVar15,auVar87,auVar330);
    auVar87 = vmovshdup_avx(auVar218);
    auVar331._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
    auVar331._8_4_ = auVar87._8_4_ ^ 0x80000000;
    auVar331._12_4_ = auVar87._12_4_ ^ 0x80000000;
    auVar105 = vmovshdup_avx(auVar285);
    auVar15 = vunpcklps_avx(auVar105,auVar331);
    auVar111 = vshufps_avx(auVar15,auVar331,4);
    auVar201 = vshufps_avx(auVar287,auVar287,0x54);
    auVar159._0_8_ = auVar285._0_8_ ^ 0x8000000080000000;
    auVar159._8_4_ = auVar285._8_4_ ^ 0x80000000;
    auVar159._12_4_ = auVar285._12_4_ ^ 0x80000000;
    auVar15 = vmovlhps_avx(auVar159,auVar218);
    auVar15 = vshufps_avx(auVar15,auVar218,8);
    auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar285._0_4_ * auVar87._0_4_)),auVar105,auVar218);
    uVar71 = auVar87._0_4_;
    auVar92._4_4_ = uVar71;
    auVar92._0_4_ = uVar71;
    auVar92._8_4_ = uVar71;
    auVar92._12_4_ = uVar71;
    auVar87 = vdivps_avx(auVar111,auVar92);
    auVar105 = vdivps_avx(auVar15,auVar92);
    fVar129 = auVar219._0_4_;
    fVar147 = auVar87._0_4_;
    auVar15 = vshufps_avx(auVar219,auVar219,0x55);
    fVar145 = auVar105._0_4_;
    auVar93._0_4_ = fVar129 * fVar147 + auVar15._0_4_ * fVar145;
    auVar93._4_4_ = fVar129 * auVar87._4_4_ + auVar15._4_4_ * auVar105._4_4_;
    auVar93._8_4_ = fVar129 * auVar87._8_4_ + auVar15._8_4_ * auVar105._8_4_;
    auVar93._12_4_ = fVar129 * auVar87._12_4_ + auVar15._12_4_ * auVar105._12_4_;
    auVar189 = vsubps_avx(auVar201,auVar93);
    auVar201 = vmovshdup_avx(auVar87);
    auVar15 = vinsertps_avx(auVar273,auVar310,0x1c);
    auVar193._0_4_ = auVar201._0_4_ * auVar15._0_4_;
    auVar193._4_4_ = auVar201._4_4_ * auVar15._4_4_;
    auVar193._8_4_ = auVar201._8_4_ * auVar15._8_4_;
    auVar193._12_4_ = auVar201._12_4_ * auVar15._12_4_;
    auVar111 = vinsertps_avx(auVar259,auVar294,0x1c);
    auVar118._0_4_ = auVar111._0_4_ * auVar201._0_4_;
    auVar118._4_4_ = auVar111._4_4_ * auVar201._4_4_;
    auVar118._8_4_ = auVar111._8_4_ * auVar201._8_4_;
    auVar118._12_4_ = auVar111._12_4_ * auVar201._12_4_;
    auVar219 = vminps_avx(auVar193,auVar118);
    auVar218 = vmaxps_avx(auVar118,auVar193);
    auVar201 = vinsertps_avx(auVar310,auVar273,0x4c);
    auVar155 = vmovshdup_avx(auVar105);
    auVar285 = vinsertps_avx(auVar294,auVar259,0x4c);
    auVar295._0_4_ = auVar155._0_4_ * auVar201._0_4_;
    auVar295._4_4_ = auVar155._4_4_ * auVar201._4_4_;
    auVar295._8_4_ = auVar155._8_4_ * auVar201._8_4_;
    auVar295._12_4_ = auVar155._12_4_ * auVar201._12_4_;
    auVar274._0_4_ = auVar155._0_4_ * auVar285._0_4_;
    auVar274._4_4_ = auVar155._4_4_ * auVar285._4_4_;
    auVar274._8_4_ = auVar155._8_4_ * auVar285._8_4_;
    auVar274._12_4_ = auVar155._12_4_ * auVar285._12_4_;
    auVar155 = vminps_avx(auVar295,auVar274);
    auVar311._0_4_ = auVar219._0_4_ + auVar155._0_4_;
    auVar311._4_4_ = auVar219._4_4_ + auVar155._4_4_;
    auVar311._8_4_ = auVar219._8_4_ + auVar155._8_4_;
    auVar311._12_4_ = auVar219._12_4_ + auVar155._12_4_;
    auVar219 = vmaxps_avx(auVar274,auVar295);
    auVar119._0_4_ = auVar219._0_4_ + auVar218._0_4_;
    auVar119._4_4_ = auVar219._4_4_ + auVar218._4_4_;
    auVar119._8_4_ = auVar219._8_4_ + auVar218._8_4_;
    auVar119._12_4_ = auVar219._12_4_ + auVar218._12_4_;
    auVar275._8_8_ = 0x3f80000000000000;
    auVar275._0_8_ = 0x3f80000000000000;
    auVar218 = vsubps_avx(auVar275,auVar119);
    auVar219 = vsubps_avx(auVar275,auVar311);
    auVar155 = vsubps_avx(auVar293,auVar287);
    auVar238 = vsubps_avx(auVar130,auVar287);
    auVar138._0_4_ = fVar147 * auVar15._0_4_;
    auVar138._4_4_ = fVar147 * auVar15._4_4_;
    auVar138._8_4_ = fVar147 * auVar15._8_4_;
    auVar138._12_4_ = fVar147 * auVar15._12_4_;
    auVar312._0_4_ = fVar147 * auVar111._0_4_;
    auVar312._4_4_ = fVar147 * auVar111._4_4_;
    auVar312._8_4_ = fVar147 * auVar111._8_4_;
    auVar312._12_4_ = fVar147 * auVar111._12_4_;
    auVar111 = vminps_avx(auVar138,auVar312);
    auVar15 = vmaxps_avx(auVar312,auVar138);
    auVar194._0_4_ = fVar145 * auVar201._0_4_;
    auVar194._4_4_ = fVar145 * auVar201._4_4_;
    auVar194._8_4_ = fVar145 * auVar201._8_4_;
    auVar194._12_4_ = fVar145 * auVar201._12_4_;
    auVar260._0_4_ = fVar145 * auVar285._0_4_;
    auVar260._4_4_ = fVar145 * auVar285._4_4_;
    auVar260._8_4_ = fVar145 * auVar285._8_4_;
    auVar260._12_4_ = fVar145 * auVar285._12_4_;
    auVar201 = vminps_avx(auVar194,auVar260);
    auVar313._0_4_ = auVar111._0_4_ + auVar201._0_4_;
    auVar313._4_4_ = auVar111._4_4_ + auVar201._4_4_;
    auVar313._8_4_ = auVar111._8_4_ + auVar201._8_4_;
    auVar313._12_4_ = auVar111._12_4_ + auVar201._12_4_;
    fVar181 = auVar155._0_4_;
    auVar324._0_4_ = fVar181 * auVar218._0_4_;
    fVar182 = auVar155._4_4_;
    auVar324._4_4_ = fVar182 * auVar218._4_4_;
    fVar233 = auVar155._8_4_;
    auVar324._8_4_ = fVar233 * auVar218._8_4_;
    fVar234 = auVar155._12_4_;
    auVar324._12_4_ = fVar234 * auVar218._12_4_;
    auVar111 = vmaxps_avx(auVar260,auVar194);
    auVar261._0_4_ = fVar181 * auVar219._0_4_;
    auVar261._4_4_ = fVar182 * auVar219._4_4_;
    auVar261._8_4_ = fVar233 * auVar219._8_4_;
    auVar261._12_4_ = fVar234 * auVar219._12_4_;
    fVar129 = auVar238._0_4_;
    auVar120._0_4_ = fVar129 * auVar218._0_4_;
    fVar142 = auVar238._4_4_;
    auVar120._4_4_ = fVar142 * auVar218._4_4_;
    fVar143 = auVar238._8_4_;
    auVar120._8_4_ = fVar143 * auVar218._8_4_;
    fVar144 = auVar238._12_4_;
    auVar120._12_4_ = fVar144 * auVar218._12_4_;
    auVar276._0_4_ = fVar129 * auVar219._0_4_;
    auVar276._4_4_ = fVar142 * auVar219._4_4_;
    auVar276._8_4_ = fVar143 * auVar219._8_4_;
    auVar276._12_4_ = fVar144 * auVar219._12_4_;
    auVar139._0_4_ = auVar15._0_4_ + auVar111._0_4_;
    auVar139._4_4_ = auVar15._4_4_ + auVar111._4_4_;
    auVar139._8_4_ = auVar15._8_4_ + auVar111._8_4_;
    auVar139._12_4_ = auVar15._12_4_ + auVar111._12_4_;
    auVar195._8_8_ = 0x3f800000;
    auVar195._0_8_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar195,auVar139);
    auVar111 = vsubps_avx(auVar195,auVar313);
    auVar314._0_4_ = fVar181 * auVar15._0_4_;
    auVar314._4_4_ = fVar182 * auVar15._4_4_;
    auVar314._8_4_ = fVar233 * auVar15._8_4_;
    auVar314._12_4_ = fVar234 * auVar15._12_4_;
    auVar296._0_4_ = fVar181 * auVar111._0_4_;
    auVar296._4_4_ = fVar182 * auVar111._4_4_;
    auVar296._8_4_ = fVar233 * auVar111._8_4_;
    auVar296._12_4_ = fVar234 * auVar111._12_4_;
    auVar140._0_4_ = fVar129 * auVar15._0_4_;
    auVar140._4_4_ = fVar142 * auVar15._4_4_;
    auVar140._8_4_ = fVar143 * auVar15._8_4_;
    auVar140._12_4_ = fVar144 * auVar15._12_4_;
    auVar196._0_4_ = fVar129 * auVar111._0_4_;
    auVar196._4_4_ = fVar142 * auVar111._4_4_;
    auVar196._8_4_ = fVar143 * auVar111._8_4_;
    auVar196._12_4_ = fVar144 * auVar111._12_4_;
    auVar15 = vminps_avx(auVar314,auVar296);
    auVar111 = vminps_avx(auVar140,auVar196);
    auVar15 = vminps_avx(auVar15,auVar111);
    auVar111 = vmaxps_avx(auVar296,auVar314);
    auVar201 = vmaxps_avx(auVar196,auVar140);
    auVar285 = vminps_avx(auVar324,auVar261);
    auVar218 = vminps_avx(auVar120,auVar276);
    auVar285 = vminps_avx(auVar285,auVar218);
    auVar15 = vhaddps_avx(auVar15,auVar285);
    auVar111 = vmaxps_avx(auVar201,auVar111);
    auVar201 = vmaxps_avx(auVar261,auVar324);
    auVar285 = vmaxps_avx(auVar276,auVar120);
    auVar201 = vmaxps_avx(auVar285,auVar201);
    auVar111 = vhaddps_avx(auVar111,auVar201);
    auVar15 = vshufps_avx(auVar15,auVar15,0xe8);
    auVar111 = vshufps_avx(auVar111,auVar111,0xe8);
    auVar277._0_4_ = auVar189._0_4_ + auVar15._0_4_;
    auVar277._4_4_ = auVar189._4_4_ + auVar15._4_4_;
    auVar277._8_4_ = auVar189._8_4_ + auVar15._8_4_;
    auVar277._12_4_ = auVar189._12_4_ + auVar15._12_4_;
    auVar262._0_4_ = auVar189._0_4_ + auVar111._0_4_;
    auVar262._4_4_ = auVar189._4_4_ + auVar111._4_4_;
    auVar262._8_4_ = auVar189._8_4_ + auVar111._8_4_;
    auVar262._12_4_ = auVar189._12_4_ + auVar111._12_4_;
    auVar15 = vmaxps_avx(auVar293,auVar277);
    auVar111 = vminps_avx(auVar262,auVar130);
    auVar15 = vcmpps_avx(auVar111,auVar15,1);
    auVar15 = vshufps_avx(auVar15,auVar15,0x50);
    if ((auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar15[0xf] < '\0')
    goto LAB_016e1ed3;
    bVar61 = 0;
    if (auVar277._0_4_ <= auVar231._0_4_) {
      auVar334 = ZEXT864(0) << 0x40;
    }
    else {
      auVar334 = ZEXT864(0) << 0x20;
      bVar61 = 0;
      if (auVar262._0_4_ < auVar130._0_4_) {
        auVar111 = vmovshdup_avx(auVar277);
        auVar15 = vcmpps_avx(auVar262,auVar130,1);
        bVar61 = auVar15[4] & auVar267._0_4_ < auVar111._0_4_;
      }
    }
    if (((3 < uVar68 || fVar100 < 0.001) | bVar61) != 1) {
      auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)fVar146),0x10);
      auVar232 = ZEXT1664(auVar14);
      auVar14 = vinsertps_avx(auVar267,ZEXT416((uint)auVar316._0_4_),0x10);
      auVar334 = ZEXT1664(auVar14);
      goto LAB_016e1a9a;
    }
    lVar64 = 200;
    do {
      fVar142 = auVar189._0_4_;
      fVar129 = 1.0 - fVar142;
      fVar100 = fVar129 * fVar129 * fVar129;
      fVar146 = fVar142 * 3.0 * fVar129 * fVar129;
      fVar129 = fVar129 * fVar142 * fVar142 * 3.0;
      auVar177._4_4_ = fVar100;
      auVar177._0_4_ = fVar100;
      auVar177._8_4_ = fVar100;
      auVar177._12_4_ = fVar100;
      auVar141._4_4_ = fVar146;
      auVar141._0_4_ = fVar146;
      auVar141._8_4_ = fVar146;
      auVar141._12_4_ = fVar146;
      auVar121._4_4_ = fVar129;
      auVar121._0_4_ = fVar129;
      auVar121._8_4_ = fVar129;
      auVar121._12_4_ = fVar129;
      fVar142 = fVar142 * fVar142 * fVar142;
      local_770 = auVar19._0_4_;
      fStack_76c = auVar19._4_4_;
      fStack_768 = auVar19._8_4_;
      fStack_764 = auVar19._12_4_;
      auVar197._0_4_ = fVar142 * local_770;
      auVar197._4_4_ = fVar142 * fStack_76c;
      auVar197._8_4_ = fVar142 * fStack_768;
      auVar197._12_4_ = fVar142 * fStack_764;
      auVar14 = vfmadd231ps_fma(auVar197,auVar169,auVar121);
      auVar14 = vfmadd231ps_fma(auVar14,auVar18,auVar141);
      auVar14 = vfmadd231ps_fma(auVar14,auVar17,auVar177);
      auVar122._8_8_ = auVar14._0_8_;
      auVar122._0_8_ = auVar14._0_8_;
      auVar14 = vshufpd_avx(auVar14,auVar14,3);
      auVar15 = vshufps_avx(auVar189,auVar189,0x55);
      auVar14 = vsubps_avx(auVar14,auVar122);
      auVar15 = vfmadd213ps_fma(auVar14,auVar15,auVar122);
      fVar100 = auVar15._0_4_;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar123._0_4_ = fVar147 * fVar100 + fVar145 * auVar14._0_4_;
      auVar123._4_4_ = auVar87._4_4_ * fVar100 + auVar105._4_4_ * auVar14._4_4_;
      auVar123._8_4_ = auVar87._8_4_ * fVar100 + auVar105._8_4_ * auVar14._8_4_;
      auVar123._12_4_ = auVar87._12_4_ * fVar100 + auVar105._12_4_ * auVar14._12_4_;
      auVar189 = vsubps_avx(auVar189,auVar123);
      auVar14 = vandps_avx(auVar327,auVar15);
      auVar15 = vshufps_avx(auVar14,auVar14,0xf5);
      auVar14 = vmaxss_avx(auVar15,auVar14);
      if (auVar14._0_4_ < fVar99) {
        local_120 = auVar189._0_4_;
        if ((0.0 <= local_120) && (local_120 <= 1.0)) {
          auVar14 = vmovshdup_avx(auVar189);
          fVar100 = auVar14._0_4_;
          if ((0.0 <= fVar100) && (fVar100 <= 1.0)) {
            auVar15 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar285 = vinsertps_avx(auVar15,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                     0x28);
            auVar15 = vdpps_avx(auVar285,auVar167,0x7f);
            auVar87 = vdpps_avx(auVar285,auVar20,0x7f);
            auVar105 = vdpps_avx(auVar285,local_3a0,0x7f);
            auVar111 = vdpps_avx(auVar285,local_3b0,0x7f);
            auVar293 = vdpps_avx(auVar285,local_3c0,0x7f);
            auVar130 = vdpps_avx(auVar285,local_3d0,0x7f);
            auVar201 = vdpps_avx(auVar285,local_3e0,0x7f);
            auVar285 = vdpps_avx(auVar285,local_3f0,0x7f);
            fVar146 = 1.0 - fVar100;
            auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar293._0_4_)),
                                      ZEXT416((uint)fVar146),auVar15);
            auVar87 = vfmadd231ss_fma(ZEXT416((uint)(auVar130._0_4_ * fVar100)),
                                      ZEXT416((uint)fVar146),auVar87);
            auVar105 = vfmadd231ss_fma(ZEXT416((uint)(auVar201._0_4_ * fVar100)),
                                       ZEXT416((uint)fVar146),auVar105);
            auVar111 = vfmadd231ss_fma(ZEXT416((uint)(fVar100 * auVar285._0_4_)),
                                       ZEXT416((uint)fVar146),auVar111);
            fVar145 = 1.0 - local_120;
            fVar100 = fVar145 * local_120 * local_120 * 3.0;
            fVar142 = local_120 * local_120 * local_120;
            auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * auVar111._0_4_)),
                                       ZEXT416((uint)fVar100),auVar105);
            fVar146 = local_120 * 3.0 * fVar145 * fVar145;
            auVar87 = vfmadd231ss_fma(auVar105,ZEXT416((uint)fVar146),auVar87);
            fVar147 = fVar145 * fVar145 * fVar145;
            auVar15 = vfmadd231ss_fma(auVar87,ZEXT416((uint)fVar147),auVar15);
            fVar129 = auVar15._0_4_;
            if ((fVar70 <= fVar129) &&
               (fVar143 = *(float *)(ray + k * 4 + 0x100), fVar129 <= fVar143)) {
              pGVar7 = (context->scene->geometries).items[uVar63].ptr;
              if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_016e2ea4:
                bVar61 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar61 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar15 = vshufps_avx(auVar189,auVar189,0x55);
                auVar263._8_4_ = 0x3f800000;
                auVar263._0_8_ = 0x3f8000003f800000;
                auVar263._12_4_ = 0x3f800000;
                auVar87 = vsubps_avx(auVar263,auVar15);
                local_520 = auVar75._0_4_;
                fStack_51c = auVar75._4_4_;
                fStack_518 = auVar75._8_4_;
                fStack_514 = auVar75._12_4_;
                fVar144 = auVar15._0_4_;
                auVar278._0_4_ = fVar144 * local_520;
                fVar181 = auVar15._4_4_;
                auVar278._4_4_ = fVar181 * fStack_51c;
                fVar182 = auVar15._8_4_;
                auVar278._8_4_ = fVar182 * fStack_518;
                fVar233 = auVar15._12_4_;
                auVar278._12_4_ = fVar233 * fStack_514;
                local_5d0 = auVar72._0_4_;
                fStack_5cc = auVar72._4_4_;
                fStack_5c8 = auVar72._8_4_;
                fStack_5c4 = auVar72._12_4_;
                auVar288._0_4_ = fVar144 * local_5d0;
                auVar288._4_4_ = fVar181 * fStack_5cc;
                auVar288._8_4_ = fVar182 * fStack_5c8;
                auVar288._12_4_ = fVar233 * fStack_5c4;
                local_530 = auVar73._0_4_;
                fStack_52c = auVar73._4_4_;
                fStack_528 = auVar73._8_4_;
                fStack_524 = auVar73._12_4_;
                auVar297._0_4_ = fVar144 * local_530;
                auVar297._4_4_ = fVar181 * fStack_52c;
                auVar297._8_4_ = fVar182 * fStack_528;
                auVar297._12_4_ = fVar233 * fStack_524;
                local_5e0 = auVar103._0_4_;
                fStack_5dc = auVar103._4_4_;
                fStack_5d8 = auVar103._8_4_;
                fStack_5d4 = auVar103._12_4_;
                auVar247._0_4_ = fVar144 * local_5e0;
                auVar247._4_4_ = fVar181 * fStack_5dc;
                auVar247._8_4_ = fVar182 * fStack_5d8;
                auVar247._12_4_ = fVar233 * fStack_5d4;
                auVar15 = vfmadd231ps_fma(auVar278,auVar87,auVar21);
                auVar105 = vfmadd231ps_fma(auVar288,auVar87,auVar22);
                auVar111 = vfmadd231ps_fma(auVar297,auVar87,auVar30);
                auVar293 = vfmadd231ps_fma(auVar247,auVar87,auVar74);
                auVar15 = vsubps_avx(auVar105,auVar15);
                auVar87 = vsubps_avx(auVar111,auVar105);
                auVar105 = vsubps_avx(auVar293,auVar111);
                auVar298._0_4_ = local_120 * auVar87._0_4_;
                auVar298._4_4_ = local_120 * auVar87._4_4_;
                auVar298._8_4_ = local_120 * auVar87._8_4_;
                auVar298._12_4_ = local_120 * auVar87._12_4_;
                auVar228._4_4_ = fVar145;
                auVar228._0_4_ = fVar145;
                auVar228._8_4_ = fVar145;
                auVar228._12_4_ = fVar145;
                auVar15 = vfmadd231ps_fma(auVar298,auVar228,auVar15);
                auVar248._0_4_ = local_120 * auVar105._0_4_;
                auVar248._4_4_ = local_120 * auVar105._4_4_;
                auVar248._8_4_ = local_120 * auVar105._8_4_;
                auVar248._12_4_ = local_120 * auVar105._12_4_;
                auVar87 = vfmadd231ps_fma(auVar248,auVar228,auVar87);
                auVar249._0_4_ = local_120 * auVar87._0_4_;
                auVar249._4_4_ = local_120 * auVar87._4_4_;
                auVar249._8_4_ = local_120 * auVar87._8_4_;
                auVar249._12_4_ = local_120 * auVar87._12_4_;
                auVar87 = vfmadd231ps_fma(auVar249,auVar228,auVar15);
                auVar216._0_4_ = fVar142 * (float)local_450._0_4_;
                auVar216._4_4_ = fVar142 * (float)local_450._4_4_;
                auVar216._8_4_ = fVar142 * fStack_448;
                auVar216._12_4_ = fVar142 * fStack_444;
                auVar160._4_4_ = fVar100;
                auVar160._0_4_ = fVar100;
                auVar160._8_4_ = fVar100;
                auVar160._12_4_ = fVar100;
                auVar15 = vfmadd132ps_fma(auVar160,auVar216,local_440);
                auVar198._4_4_ = fVar146;
                auVar198._0_4_ = fVar146;
                auVar198._8_4_ = fVar146;
                auVar198._12_4_ = fVar146;
                auVar15 = vfmadd132ps_fma(auVar198,auVar15,local_430);
                auVar161._0_4_ = auVar87._0_4_ * 3.0;
                auVar161._4_4_ = auVar87._4_4_ * 3.0;
                auVar161._8_4_ = auVar87._8_4_ * 3.0;
                auVar161._12_4_ = auVar87._12_4_ * 3.0;
                auVar178._4_4_ = fVar147;
                auVar178._0_4_ = fVar147;
                auVar178._8_4_ = fVar147;
                auVar178._12_4_ = fVar147;
                auVar87 = vfmadd132ps_fma(auVar178,auVar15,local_420);
                auVar15 = vshufps_avx(auVar161,auVar161,0xc9);
                auVar199._0_4_ = auVar87._0_4_ * auVar15._0_4_;
                auVar199._4_4_ = auVar87._4_4_ * auVar15._4_4_;
                auVar199._8_4_ = auVar87._8_4_ * auVar15._8_4_;
                auVar199._12_4_ = auVar87._12_4_ * auVar15._12_4_;
                auVar15 = vshufps_avx(auVar87,auVar87,0xc9);
                auVar87 = vfmsub231ps_fma(auVar199,auVar161,auVar15);
                auVar15 = vmovshdup_avx(auVar87);
                local_180 = auVar15._0_8_;
                uStack_178 = local_180;
                uStack_170 = local_180;
                uStack_168 = local_180;
                auVar15 = vshufps_avx(auVar87,auVar87,0xaa);
                local_160 = auVar15._0_8_;
                uStack_158 = local_160;
                uStack_150 = local_160;
                uStack_148 = local_160;
                local_140 = auVar87._0_4_;
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                fStack_11c = local_120;
                fStack_118 = local_120;
                fStack_114 = local_120;
                fStack_110 = local_120;
                fStack_10c = local_120;
                fStack_108 = local_120;
                fStack_104 = local_120;
                local_100 = auVar14._0_8_;
                uStack_f8 = local_100;
                uStack_f0 = local_100;
                uStack_e8 = local_100;
                local_e0 = CONCAT44(uStack_2dc,local_2e0);
                uStack_d8 = CONCAT44(uStack_2d4,uStack_2d8);
                uStack_d0 = CONCAT44(uStack_2cc,uStack_2d0);
                uStack_c8 = CONCAT44(uStack_2c4,uStack_2c8);
                local_c0._4_4_ = uStack_2bc;
                local_c0._0_4_ = local_2c0;
                local_c0._8_4_ = uStack_2b8;
                local_c0._12_4_ = uStack_2b4;
                local_c0._16_4_ = uStack_2b0;
                local_c0._20_4_ = uStack_2ac;
                local_c0._24_4_ = uStack_2a8;
                local_c0._28_4_ = uStack_2a4;
                vpcmpeqd_avx2(local_c0,local_c0);
                uStack_9c = context->user->instID[0];
                local_a0 = uStack_9c;
                uStack_98 = uStack_9c;
                uStack_94 = uStack_9c;
                uStack_90 = uStack_9c;
                uStack_8c = uStack_9c;
                uStack_88 = uStack_9c;
                uStack_84 = uStack_9c;
                uStack_7c = context->user->instPrimID[0];
                local_80 = uStack_7c;
                uStack_78 = uStack_7c;
                uStack_74 = uStack_7c;
                uStack_70 = uStack_7c;
                uStack_6c = uStack_7c;
                uStack_68 = uStack_7c;
                uStack_64 = uStack_7c;
                *(float *)(ray + k * 4 + 0x100) = fVar129;
                local_480 = local_300;
                local_4b0.valid = (int *)local_480;
                local_4b0.geometryUserPtr = pGVar7->userPtr;
                local_4b0.context = context->user;
                local_4b0.ray = (RTCRayN *)ray;
                local_4b0.hit = (RTCHitN *)&local_180;
                local_4b0.N = 8;
                if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar7->occlusionFilterN)(&local_4b0);
                  auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                auVar95 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                auVar95 = _DAT_01fe9960 & ~auVar95;
                if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar95 >> 0x7f,0) != '\0') ||
                      (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar95 >> 0xbf,0) != '\0') ||
                    (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar95[0x1f] < '\0') {
                  p_Var13 = context->args->filter;
                  if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var13)(&local_4b0);
                    auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar24 = vpcmpeqd_avx2(local_480,_DAT_01faff00);
                  auVar128._8_4_ = 0xff800000;
                  auVar128._0_8_ = 0xff800000ff800000;
                  auVar128._12_4_ = 0xff800000;
                  auVar128._16_4_ = 0xff800000;
                  auVar128._20_4_ = 0xff800000;
                  auVar128._24_4_ = 0xff800000;
                  auVar128._28_4_ = 0xff800000;
                  auVar95 = vblendvps_avx(auVar128,*(undefined1 (*) [32])(local_4b0.ray + 0x100),
                                          auVar24);
                  *(undefined1 (*) [32])(local_4b0.ray + 0x100) = auVar95;
                  auVar95 = _DAT_01fe9960 & ~auVar24;
                  if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar95 >> 0x7f,0) != '\0') ||
                        (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar95 >> 0xbf,0) != '\0') ||
                      (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar95[0x1f] < '\0') {
                    bVar61 = 1;
                    goto LAB_016e2ea6;
                  }
                }
                *(float *)(ray + k * 4 + 0x100) = fVar143;
                goto LAB_016e2ea4;
              }
LAB_016e2ea6:
              bVar69 = (bool)(bVar69 | bVar61);
            }
          }
        }
        break;
      }
      lVar64 = lVar64 + -1;
    } while (lVar64 != 0);
  }
  goto LAB_016e2029;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }